

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

bool __thiscall ImFontAtlas::Build(ImFontAtlas *this)

{
  uint *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  byte bVar4;
  byte bVar5;
  ImWchar IVar6;
  undefined2 uVar7;
  ImFont *pIVar8;
  ImFontConfig *pIVar9;
  stbtt_fontinfo *info;
  undefined8 *puVar10;
  char cVar11;
  char cVar16;
  undefined1 auVar24 [15];
  undefined1 auVar25 [14];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [14];
  undefined1 auVar30 [16];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  stbtt__buf fontdict;
  undefined1 auVar35 [15];
  unkuint9 Var36;
  undefined1 auVar37 [15];
  undefined1 auVar38 [13];
  undefined1 auVar39 [14];
  undefined1 auVar40 [12];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [15];
  unkbyte10 Var44;
  uint6 uVar45;
  undefined1 auVar46 [14];
  undefined1 auVar47 [16];
  stbtt__active_edge **ppsVar48;
  bool bVar49;
  ushort uVar50;
  ushort uVar51;
  short sVar52;
  stbtt_uint32 sVar53;
  stbtt_uint32 sVar54;
  stbtt_uint32 sVar55;
  stbtt_uint32 sVar56;
  stbtt_uint32 sVar57;
  stbtt_uint32 sVar58;
  stbtt_uint32 sVar59;
  uint uVar60;
  int iVar61;
  int iVar62;
  void *pvVar63;
  int extraout_var;
  int *piVar64;
  void *pvVar65;
  stbrp_context *ptr;
  stbrp_node *ptr_00;
  uchar *puVar66;
  void *pvVar67;
  stbtt__buf *scanline;
  stbtt__active_edge *psVar68;
  stbtt__buf *psVar69;
  stbtt__active_edge *psVar70;
  bool bVar71;
  short sVar72;
  uint uVar73;
  uint uVar74;
  ImWchar *pIVar75;
  ushort *puVar76;
  long lVar77;
  ulong uVar78;
  long lVar79;
  bool bVar80;
  int iVar81;
  ulong uVar82;
  undefined8 *puVar83;
  long lVar84;
  ImFontAtlas *atlas;
  uchar uVar85;
  stbtt__edge *psVar86;
  ulong uVar87;
  ulong uVar88;
  uint *puVar89;
  stbrp_node **ppsVar90;
  byte *pbVar91;
  stbtt__edge *psVar92;
  int iVar93;
  int iVar94;
  int iVar95;
  uint uVar96;
  float fVar97;
  uint uVar98;
  long lVar99;
  ImFontConfig *pIVar100;
  stbtt_fontinfo *psVar101;
  byte *pbVar102;
  byte bVar103;
  char cVar111;
  char cVar112;
  char cVar114;
  ushort uVar113;
  short sVar115;
  short sVar116;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  float fVar117;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  float fVar139;
  float fVar140;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  float fVar141;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  float fVar142;
  float fVar147;
  float fVar148;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  uint uVar149;
  float fVar150;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  float fVar151;
  undefined4 uVar152;
  uint uVar159;
  float fVar160;
  uint uVar161;
  float fVar162;
  uint uVar163;
  float fVar164;
  undefined1 auVar157 [16];
  float fVar165;
  uint uVar170;
  uint uVar172;
  undefined1 auVar166 [16];
  float fVar171;
  float fVar173;
  uint uVar174;
  float fVar175;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined4 uVar176;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  stbtt__buf sVar191;
  undefined4 in_stack_fffffffffffffaf8;
  undefined1 in_stack_fffffffffffffafc [12];
  undefined4 in_stack_fffffffffffffb24;
  undefined1 auStack_4c8 [16];
  uint uStack_4b0;
  stbtt_uint32 sStack_4ac;
  undefined1 auStack_4a8 [16];
  ulong uStack_498;
  float fStack_48c;
  undefined1 auStack_488 [16];
  stbtt__edge *psStack_470;
  undefined8 uStack_468;
  int iStack_45c;
  undefined1 auStack_458 [16];
  void *pvStack_440;
  ulong uStack_438;
  undefined8 uStack_430;
  int iStack_424;
  int iStack_420;
  float fStack_41c;
  undefined1 auStack_418 [8];
  void *pvStack_410;
  long lStack_408;
  void *pvStack_400;
  ulong uStack_3f8;
  stbtt__active_edge *psStack_3f0;
  ulong uStack_3e8;
  float fStack_3dc;
  long lStack_3d8;
  void *pvStack_3d0;
  stbtt_fontinfo *psStack_3c0;
  undefined8 *puStack_3b8;
  long lStack_3b0;
  long lStack_3a8;
  ImFontConfig *pIStack_3a0;
  ImFontConfig *pIStack_398;
  undefined4 uStack_390;
  undefined4 uStack_38c;
  uchar *puStack_388;
  ulong uStack_380;
  ulong uStack_378;
  uchar *puStack_370;
  float *pfStack_368;
  int iStack_35c;
  uint uStack_358;
  uint uStack_354;
  float fStack_350;
  int iStack_34c;
  int iStack_348;
  int iStack_344;
  stbrp_context *psStack_340;
  long lStack_338;
  float *pfStack_330;
  ulong uStack_328;
  ulong uStack_320;
  undefined1 auStack_318 [16];
  stbrp_node *psStack_300;
  ImFontConfig *pIStack_2f8;
  long lStack_2f0;
  size_t sStack_2e8;
  size_t sStack_2e0;
  long lStack_2d8;
  short *psStack_2d0;
  long lStack_2c8;
  int iStack_2c0;
  int iStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  undefined1 auStack_2a8 [16];
  undefined1 auStack_298 [16];
  undefined1 auStack_288 [16];
  undefined1 auStack_278 [16];
  undefined1 auStack_268 [16];
  undefined1 auStack_258 [16];
  undefined1 auStack_248 [8];
  float fStack_240;
  float fStack_23c;
  stbtt__buf asStack_238 [32];
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined6 uVar153;
  undefined8 uVar154;
  undefined1 auVar155 [12];
  undefined1 auVar156 [14];
  undefined1 auVar158 [16];
  undefined6 uVar177;
  undefined8 uVar178;
  undefined1 auVar179 [12];
  undefined1 auVar180 [14];
  undefined1 auVar184 [16];
  
  uVar154 = auStack_4c8._0_8_;
  auStack_488._8_8_ = auStack_488._0_8_;
  if (this->FontBuilderIO != (ImFontBuilderIO *)0x0) {
    bVar49 = (*this->FontBuilderIO->FontBuilder_Build)(this);
    return bVar49;
  }
  ImFontAtlasGetBuilderForStbTruetype::io.FontBuilder_Build = ImFontAtlasBuildWithStbTruetype;
  ImFontAtlasBuildInit(this);
  this->TexID = (ImTextureID)0x0;
  this->TexWidth = 0;
  this->TexHeight = 0;
  (this->TexUvScale).x = 0.0;
  (this->TexUvScale).y = 0.0;
  (this->TexUvWhitePixel).x = 0.0;
  (this->TexUvWhitePixel).y = 0.0;
  ClearTexData(this);
  lStack_408 = 0;
  pvStack_400 = (void *)0x0;
  lStack_3d8 = 0;
  pvStack_3d0 = (void *)0x0;
  uVar60 = (this->ConfigData).Size;
  if (0 < (long)(int)uVar60) {
    uVar82 = 8;
    if (8 < uVar60) {
      uVar82 = (ulong)uVar60;
    }
    pvStack_400 = ImGui::MemAlloc(uVar82 * 0x110);
    lStack_408 = uVar82 << 0x20;
  }
  pvVar67 = pvStack_400;
  auStack_488._0_8_ = (long)(int)uVar60;
  lStack_408 = CONCAT44(lStack_408._4_4_,uVar60);
  uVar60 = (this->Fonts).Size;
  if ((long)(int)uVar60 < 1) {
    pvVar63 = (void *)0x0;
  }
  else {
    uVar82 = 8;
    if (8 < uVar60) {
      uVar82 = (ulong)uVar60;
    }
    pvVar63 = ImGui::MemAlloc(uVar82 << 5);
    lStack_3d8 = uVar82 << 0x20;
    pvStack_3d0 = pvVar63;
  }
  lStack_3d8 = CONCAT44(lStack_3d8._4_4_,uVar60);
  auVar118._8_8_ = 0;
  auVar118._0_8_ = auStack_4c8._0_8_;
  auStack_4c8 = auVar118 << 0x40;
  auVar118 = auStack_4c8;
  auStack_4c8._8_8_ = uVar154;
  memset(pvVar67,0,auStack_488._0_8_ * 0x110);
  memset(pvVar63,0,(long)(int)uVar60 << 5);
  auStack_4a8._8_8_ = this;
  if (0 < (this->ConfigData).Size) {
    lVar99 = 0;
    auStack_4c8 = auVar118;
    do {
      pIVar100 = ((ImVector<ImFontConfig> *)(auStack_4a8._8_8_ + 0x60))->Data + lVar99;
      lVar84 = lVar99 * 0x110;
      *(undefined4 *)((long)pvVar67 + lVar84 + 0xe0) = 0xffffffff;
      uVar82 = (ulong)((ImVector<ImFont_*> *)(auStack_4a8._8_8_ + 0x40))->Size;
      if ((long)uVar82 < 1) {
LAB_001f2dd8:
        bVar49 = false;
        goto LAB_001f2da0;
      }
      uVar78 = 0;
      while (pIVar8 = ((ImVector<ImFont_*> *)(auStack_4a8._8_8_ + 0x40))->Data[uVar78],
            pIVar100->DstFont != pIVar8) {
        uVar78 = uVar78 + 1;
        bVar49 = false;
        if ((uVar82 <= uVar78) || (pIVar100->DstFont == pIVar8)) goto LAB_001f2da0;
      }
      *(int *)((long)pvVar67 + lVar84 + 0xe0) = (int)uVar78;
      pbVar102 = (byte *)pIVar100->FontData;
      iVar81 = pIVar100->FontNo;
      bVar103 = *pbVar102;
      sVar59 = 0xffffffff;
      auStack_458._0_8_ = lVar99;
      if (bVar103 < 0x4f) {
        if (bVar103 == 0) {
          if (pbVar102[1] == 1) goto LAB_001efb99;
        }
        else if ((bVar103 == 0x31) && (pbVar102[1] == 0)) {
LAB_001efb99:
          if ((pbVar102[2] == 0) && (pbVar102[3] == 0)) {
LAB_001efc05:
            sVar59 = -(uint)(iVar81 != 0);
          }
        }
      }
      else if (bVar103 == 0x4f) {
        if (((pbVar102[1] == 0x54) && (pbVar102[2] == 0x54)) && (pbVar102[3] == 0x4f))
        goto LAB_001efc05;
      }
      else if (bVar103 == 0x74) {
        bVar103 = pbVar102[1];
        if (bVar103 == 0x72) {
          if ((pbVar102[2] == 0x75) && (pbVar102[3] == 0x65)) goto LAB_001efc05;
        }
        else if (bVar103 == 0x74) {
          if ((pbVar102[2] == 99) && (pbVar102[3] == 0x66)) {
            uVar60 = *(uint *)(pbVar102 + 4);
            uVar60 = uVar60 >> 0x18 | (uVar60 & 0xff0000) >> 8 | (uVar60 & 0xff00) << 8 |
                     uVar60 << 0x18;
            if (((uVar60 == 0x20000) || (uVar60 == 0x10000)) &&
               (uVar60 = *(uint *)(pbVar102 + 8),
               iVar81 < (int)(uVar60 >> 0x18 | (uVar60 & 0xff0000) >> 8 | (uVar60 & 0xff00) << 8 |
                             uVar60 << 0x18))) {
              uVar60 = *(uint *)(pbVar102 + (long)iVar81 * 4 + 0xc);
              sVar59 = uVar60 >> 0x18 | (uVar60 & 0xff0000) >> 8 | (uVar60 & 0xff00) << 8 |
                       uVar60 << 0x18;
            }
          }
        }
        else if (((bVar103 == 0x79) && (pbVar102[2] == 0x70)) && (pbVar102[3] == 0x31))
        goto LAB_001efc05;
      }
      *(byte **)((long)pvVar67 + lVar84 + 8) = pbVar102;
      *(stbtt_uint32 *)((long)pvVar67 + lVar84 + 0x10) = sVar59;
      *(undefined8 *)((long)pvVar67 + lVar84 + 0x40) = 0;
      *(undefined8 *)((long)pvVar67 + lVar84 + 0x48) = 0;
      pIStack_398 = pIVar100;
      sVar53 = stbtt__find_table(pbVar102,sVar59,"cmap");
      iVar81 = extraout_var;
      fStack_48c = (float)stbtt__find_table(pbVar102,sVar59,"loca");
      *(float *)((long)pvVar67 + lVar84 + 0x18) = fStack_48c;
      sVar54 = stbtt__find_table(pbVar102,sVar59,"head");
      *(stbtt_uint32 *)((long)pvVar67 + lVar84 + 0x1c) = sVar54;
      sVar55 = stbtt__find_table(pbVar102,sVar59,"glyf");
      *(stbtt_uint32 *)((long)pvVar67 + lVar84 + 0x20) = sVar55;
      sVar56 = stbtt__find_table(pbVar102,sVar59,"hhea");
      *(stbtt_uint32 *)((long)pvVar67 + lVar84 + 0x24) = sVar56;
      sVar57 = stbtt__find_table(pbVar102,sVar59,"hmtx");
      *(stbtt_uint32 *)((long)pvVar67 + lVar84 + 0x28) = sVar57;
      sVar58 = stbtt__find_table(pbVar102,sVar59,"kern");
      *(stbtt_uint32 *)((long)pvVar67 + lVar84 + 0x2c) = sVar58;
      sVar58 = stbtt__find_table(pbVar102,sVar59,"GPOS");
      *(stbtt_uint32 *)((long)pvVar67 + lVar84 + 0x30) = sVar58;
      bVar49 = false;
      if (((sVar53 == 0) || (sVar54 == 0)) || ((sVar56 == 0 || (sVar57 == 0)))) goto LAB_001f2da0;
      uStack_468 = CONCAT44(uStack_468._4_4_,sVar54);
      if (sVar55 == 0) {
        lStack_3a8 = CONCAT44(lStack_3a8._4_4_,2);
        auStack_4a8._0_8_ = auStack_4a8._0_8_ & 0xffffffff00000000;
        uStack_430._0_4_ = 0;
        sStack_4ac = 0;
        sVar54 = stbtt__find_table(pbVar102,sVar59,"CFF ");
        if (sVar54 != 0) {
          *(undefined8 *)((long)pvVar67 + lVar84 + 0x90) = 0;
          *(undefined8 *)((long)pvVar67 + lVar84 + 0x98) = 0;
          *(undefined8 *)((long)pvVar67 + lVar84 + 0x80) = 0;
          *(undefined8 *)((long)pvVar67 + lVar84 + 0x88) = 0;
          *(byte **)((long)pvVar67 + lVar84 + 0x40) = pbVar102 + sVar54;
          *(undefined8 *)((long)pvVar67 + lVar84 + 0x48) = 0x2000000000000000;
          asStack_238[0].data = *(uchar **)((long)pvVar67 + lVar84 + 0x40);
          uVar154 = *(undefined8 *)((long)pvVar67 + lVar84 + 0x48);
          asStack_238[0].cursor = (int)uVar154;
          asStack_238[0].size = (int)((ulong)uVar154 >> 0x20);
          uVar60 = asStack_238[0].cursor + 2U;
          if (asStack_238[0].size < (int)(asStack_238[0].cursor + 2U)) {
            uVar60 = asStack_238[0].size;
          }
          if (asStack_238[0].cursor < -2) {
            uVar60 = asStack_238[0].size;
          }
          asStack_238[0].cursor = 0;
          if ((int)uVar60 < asStack_238[0].size) {
            asStack_238[0].cursor = (int)asStack_238[0].data[(int)uVar60];
          }
          if (asStack_238[0].size < asStack_238[0].cursor) {
            asStack_238[0].cursor = asStack_238[0].size;
          }
          stbtt__cff_get_index(asStack_238);
          sVar191 = stbtt__cff_get_index(asStack_238);
          _auStack_418 = stbtt__cff_index_get(sVar191,0);
          stbtt__cff_get_index(asStack_238);
          sVar191 = stbtt__cff_get_index(asStack_238);
          *(stbtt__buf *)((long)pvVar67 + lVar84 + 0x60) = sVar191;
          stbtt__dict_get_ints((stbtt__buf *)auStack_418,0x11,1,(stbtt_uint32 *)auStack_4a8);
          stbtt__dict_get_ints((stbtt__buf *)auStack_418,0x106,1,(stbtt_uint32 *)&lStack_3a8);
          stbtt__dict_get_ints((stbtt__buf *)auStack_418,0x124,1,(stbtt_uint32 *)&uStack_430);
          stbtt__dict_get_ints((stbtt__buf *)auStack_418,0x125,1,&sStack_4ac);
          uVar154 = asStack_238[0]._8_8_;
          sVar191._4_12_ = in_stack_fffffffffffffafc;
          sVar191.data._0_4_ = in_stack_fffffffffffffaf8;
          fontdict.data._4_4_ = in_stack_fffffffffffffb24;
          fontdict.data._0_4_ = sVar55;
          fontdict.cursor = sVar53;
          fontdict.size = iVar81;
          sVar191 = stbtt__get_subrs(sVar191,fontdict);
          sVar54 = sStack_4ac;
          *(stbtt__buf *)((long)pvVar67 + lVar84 + 0x70) = sVar191;
          if (((stbtt_uint32)lStack_3a8 == 2) &&
             (uVar152 = auStack_4a8._0_4_, auStack_4a8._0_4_ != 0)) {
            sVar55 = SUB84(uVar154,4);
            if ((stbtt_uint32)uStack_430 != 0) {
              uVar82 = (ulong)sStack_4ac;
              if (uVar82 == 0) goto LAB_001f2dd8;
              sVar56 = (stbtt_uint32)uStack_430;
              if ((int)sVar55 < (int)(stbtt_uint32)uStack_430) {
                sVar56 = sVar55;
              }
              if ((int)(stbtt_uint32)uStack_430 < 0) {
                sVar56 = sVar55;
              }
              asStack_238[0].cursor = sVar56;
              sVar191 = stbtt__cff_get_index(asStack_238);
              *(stbtt__buf *)((long)pvVar67 + lVar84 + 0x80) = sVar191;
              puVar66 = asStack_238[0].data + uVar82;
              lVar99 = (ulong)(asStack_238[0].size - sVar54) << 0x20;
              if ((int)(asStack_238[0].size - sVar54 | sVar54) < 0 ||
                  asStack_238[0].size < (int)sVar54) {
                puVar66 = (uchar *)0x0;
                lVar99 = 0;
              }
              *(uchar **)((long)pvVar67 + lVar84 + 0x90) = puVar66;
              *(long *)((long)pvVar67 + lVar84 + 0x98) = lVar99;
              sVar55 = asStack_238[0].size;
            }
            auVar132._8_8_ = 0;
            auVar132._0_8_ = auStack_4c8._8_8_;
            auStack_4c8 = auVar132 << 0x40;
            sVar54 = uVar152;
            if ((int)sVar55 < (int)uVar152) {
              sVar54 = sVar55;
            }
            if ((int)uVar152 < 0) {
              sVar54 = sVar55;
            }
            asStack_238[0].cursor = sVar54;
            sVar191 = stbtt__cff_get_index(asStack_238);
            *(stbtt__buf *)((long)pvVar67 + lVar84 + 0x50) = sVar191;
            lVar99 = auStack_458._0_8_;
            goto LAB_001effca;
          }
        }
        goto LAB_001f2dd8;
      }
      lVar99 = auStack_458._0_8_;
      if (fStack_48c == 0.0) goto LAB_001f2dd8;
LAB_001effca:
      sVar59 = stbtt__find_table(pbVar102,sVar59,"maxp");
      if (sVar59 == 0) {
        uVar60 = 0xffff;
      }
      else {
        uVar60 = (uint)(ushort)(*(ushort *)(pbVar102 + (ulong)sVar59 + 4) << 8 |
                               *(ushort *)(pbVar102 + (ulong)sVar59 + 4) >> 8);
      }
      *(uint *)((long)pvVar67 + lVar84 + 0x14) = uVar60;
      uVar50 = *(ushort *)(pbVar102 + (ulong)sVar53 + 2) << 8 |
               *(ushort *)(pbVar102 + (ulong)sVar53 + 2) >> 8;
      *(undefined4 *)((long)pvVar67 + lVar84 + 0x34) = 0;
      iVar81 = 0;
      bVar49 = false;
      if (uVar50 == 0) goto LAB_001f2da0;
      uVar60 = sVar53 + 4;
      uVar82 = (ulong)uVar50;
      do {
        uVar50 = *(ushort *)(pbVar102 + uVar60) << 8 | *(ushort *)(pbVar102 + uVar60) >> 8;
        if ((uVar50 == 0) ||
           ((uVar50 == 3 &&
            ((uVar50 = *(ushort *)(pbVar102 + (ulong)uVar60 + 2) << 8 |
                       *(ushort *)(pbVar102 + (ulong)uVar60 + 2) >> 8, uVar50 == 10 || (uVar50 == 1)
             ))))) {
          uVar96 = *(uint *)(pbVar102 + (ulong)uVar60 + 4);
          iVar81 = (uVar96 >> 0x18 | (uVar96 & 0xff0000) >> 8 | (uVar96 & 0xff00) << 8 |
                   uVar96 << 0x18) + sVar53;
          *(int *)((long)pvVar67 + lVar84 + 0x34) = iVar81;
        }
        uVar60 = uVar60 + 8;
        uVar82 = uVar82 - 1;
      } while (uVar82 != 0);
      if (iVar81 == 0) goto LAB_001f2dd8;
      *(uint *)((long)pvVar67 + lVar84 + 0x38) =
           (uint)(ushort)(*(ushort *)(pbVar102 + (long)(int)(float)uStack_468 + 0x32) << 8 |
                         *(ushort *)(pbVar102 + (long)(int)(float)uStack_468 + 0x32) >> 8);
      pIVar75 = pIStack_398->GlyphRanges;
      if (pIVar75 == (ImWchar *)0x0) {
        pIVar75 = GetGlyphRangesDefault::ranges;
      }
      *(ImWchar **)((long)pvVar67 + lVar84 + 0xd8) = pIVar75;
      IVar6 = *pIVar75;
      while (IVar6 != 0) {
        uVar50 = pIVar75[1];
        if (uVar50 == 0) break;
        uVar60 = *(uint *)((long)pvVar67 + lVar84 + 0xe4);
        uVar96 = (uint)uVar50;
        if ((int)(uint)uVar50 < (int)uVar60) {
          uVar96 = uVar60;
        }
        *(uint *)((long)pvVar67 + lVar84 + 0xe4) = uVar96;
        IVar6 = pIVar75[2];
        pIVar75 = pIVar75 + 2;
      }
      piVar64 = (int *)((long)*(int *)((long)pvVar67 + lVar84 + 0xe0) * 0x20 + (long)pvVar63);
      *piVar64 = *piVar64 + 1;
      iVar81 = *(int *)((long)pvVar67 + lVar84 + 0xe4);
      if (iVar81 < piVar64[1]) {
        iVar81 = piVar64[1];
      }
      piVar64[1] = iVar81;
      lVar99 = lVar99 + 1;
    } while (lVar99 < ((ImVector<ImFontConfig> *)(auStack_4a8._8_8_ + 0x60))->Size);
  }
  auStack_4c8._0_8_ = 0;
  uVar82 = auStack_488._0_8_;
  if (auStack_488._0_4_ < 1) {
LAB_001f042c:
    uStack_468 = 0;
  }
  else {
    lVar99 = 0;
    auVar134._8_8_ = 0;
    auVar134._0_8_ = auStack_4c8._8_8_;
    auStack_4c8 = auVar134 << 0x40;
    do {
      auStack_488._0_8_ = lVar99;
      lVar99 = lVar99 * 0x110;
      pvVar63 = (void *)((long)*(int *)((long)pvVar67 + lVar99 + 0xe0) * 0x20 + (long)pvStack_3d0);
      ImBitVector::Create((ImBitVector *)((long)pvVar67 + lVar99 + 0xf0),
                          *(int *)((long)pvVar67 + lVar99 + 0xe4) + 1);
      if (*(int *)((long)pvVar63 + 0x10) == 0) {
        ImBitVector::Create((ImBitVector *)((long)pvVar63 + 0x10),*(int *)((long)pvVar63 + 4) + 1);
      }
      puVar76 = *(ushort **)((long)pvVar67 + lVar99 + 0xd8);
      uVar50 = *puVar76;
      for (; (uVar50 != 0 && (uVar113 = puVar76[1], uVar113 != 0)); puVar76 = puVar76 + 2) {
        if (uVar50 <= uVar113) {
          uVar60 = (uint)uVar50;
          lVar84 = *(long *)((long)pvVar63 + 0x18);
          do {
            auVar118 = auStack_4c8;
            uVar96 = 1 << ((byte)uVar60 & 0x1f);
            if (((*(uint *)(lVar84 + (ulong)(uVar60 >> 5) * 4) >> (uVar60 & 0x1f) & 1) == 0) &&
               (iVar81 = stbtt_FindGlyphIndex
                                   (*(stbtt_fontinfo **)((long)pvVar67 + lVar99 + 8),
                                    *(int *)((long)pvVar67 + lVar99 + 0x34)), iVar81 != 0)) {
              piVar64 = (int *)((long)pvVar67 + lVar99 + 0xe8);
              *piVar64 = *piVar64 + 1;
              *(int *)((long)pvVar63 + 8) = *(int *)((long)pvVar63 + 8) + 1;
              uVar82 = (ulong)((uVar60 >> 5) << 2);
              puVar89 = (uint *)(*(long *)((long)pvVar67 + lVar99 + 0xf8) + uVar82);
              *puVar89 = *puVar89 | uVar96;
              puVar89 = (uint *)(lVar84 + uVar82);
              *puVar89 = *puVar89 | uVar96;
              iVar81 = auStack_4c8._0_4_;
              auStack_4c8._4_4_ = 0;
              auStack_4c8._0_4_ = iVar81 + 1;
              auStack_4c8._8_8_ = auVar118._8_8_;
            }
            uVar60 = uVar60 + 1;
          } while (uVar113 + 1 != uVar60);
        }
        uVar50 = puVar76[2];
      }
      lVar99 = auStack_488._0_8_ + 1;
      uVar82 = (ulong)(int)lStack_408;
    } while (lVar99 < (long)uVar82);
    uStack_468 = CONCAT71((int7)((ulong)lVar99 >> 8),0 < (int)lStack_408);
    if ((int)lStack_408 < 1) goto LAB_001f042c;
    uVar78 = 0;
    do {
      lVar99 = uVar78 * 0x110;
      iVar81 = *(int *)((long)pvVar67 + lVar99 + 0xe8);
      if (*(int *)((long)pvVar67 + lVar99 + 0x104) < iVar81) {
        pvVar65 = ImGui::MemAlloc((long)iVar81 << 2);
        pvVar63 = *(void **)((long)pvVar67 + lVar99 + 0x108);
        if (pvVar63 != (void *)0x0) {
          memcpy(pvVar65,pvVar63,(long)*(int *)((long)pvVar67 + lVar99 + 0x100) << 2);
          ImGui::MemFree(*(void **)((long)pvVar67 + lVar99 + 0x108));
        }
        *(void **)((long)pvVar67 + lVar99 + 0x108) = pvVar65;
        *(int *)((long)pvVar67 + lVar99 + 0x104) = iVar81;
      }
      lVar84 = (long)*(int *)((long)pvVar67 + lVar99 + 0xf0);
      puVar89 = *(uint **)((long)pvVar67 + lVar99 + 0xf8);
      if (0 < lVar84) {
        auStack_458._0_8_ = uVar78;
        auStack_488._0_8_ = uVar82;
        puVar1 = puVar89 + lVar84;
        iVar81 = 0;
        do {
          uVar152 = SUB84(puVar89,0);
          uVar176 = (undefined4)((ulong)puVar89 >> 0x20);
          uVar60 = *puVar89;
          if (uVar60 != 0) {
            uVar96 = 0;
            do {
              if ((uVar60 >> (uVar96 & 0x1f) & 1) != 0) {
                iVar93 = *(int *)((long)pvVar67 + lVar99 + 0x100);
                if (iVar93 == *(int *)((long)pvVar67 + lVar99 + 0x104)) {
                  if (iVar93 == 0) {
                    iVar61 = 8;
                  }
                  else {
                    iVar61 = iVar93 / 2 + iVar93;
                  }
                  iVar62 = iVar93 + 1;
                  if (iVar93 + 1 < iVar61) {
                    iVar62 = iVar61;
                  }
                  pvVar63 = ImGui::MemAlloc((long)iVar62 << 2);
                  pvVar65 = *(void **)((long)pvVar67 + lVar99 + 0x108);
                  if (pvVar65 != (void *)0x0) {
                    memcpy(pvVar63,pvVar65,(long)*(int *)((long)pvVar67 + lVar99 + 0x100) << 2);
                    ImGui::MemFree(*(void **)((long)pvVar67 + lVar99 + 0x108));
                  }
                  *(void **)((long)pvVar67 + lVar99 + 0x108) = pvVar63;
                  *(int *)((long)pvVar67 + lVar99 + 0x104) = iVar62;
                  iVar93 = *(int *)((long)pvVar67 + lVar99 + 0x100);
                }
                else {
                  pvVar63 = *(void **)((long)pvVar67 + lVar99 + 0x108);
                }
                *(uint *)((long)pvVar63 + (long)iVar93 * 4) = iVar81 + uVar96;
                piVar64 = (int *)((long)pvVar67 + lVar99 + 0x100);
                *piVar64 = *piVar64 + 1;
              }
              uVar96 = uVar96 + 1;
            } while (uVar96 != 0x20);
          }
          puVar89 = (uint *)(CONCAT44(uVar176,uVar152) + 4);
          iVar81 = iVar81 + 0x20;
        } while (puVar89 < puVar1);
        puVar89 = *(uint **)((long)pvVar67 + lVar99 + 0xf8);
        uVar78 = auStack_458._0_8_;
        uVar82 = auStack_488._0_8_;
      }
      if (puVar89 != (uint *)0x0) {
        *(undefined8 *)((long)pvVar67 + lVar99 + 0xf0) = 0;
        ImGui::MemFree(puVar89);
        *(undefined8 *)((long)pvVar67 + lVar99 + 0xf8) = 0;
      }
      uVar78 = uVar78 + 1;
    } while (uVar78 < uVar82);
  }
  pvVar63 = pvStack_3d0;
  atlas = (ImFontAtlas *)auStack_4a8._8_8_;
  auStack_488._0_8_ = uVar82;
  uVar82 = (ulong)(int)lStack_3d8;
  if ((long)uVar82 < 1) {
    if (pvStack_3d0 == (void *)0x0) goto LAB_001f04ab;
  }
  else {
    puVar83 = (undefined8 *)((long)pvStack_3d0 + 0x18);
    uVar78 = 0;
    do {
      if ((void *)*puVar83 != (void *)0x0) {
        puVar83[-1] = 0;
        ImGui::MemFree((void *)*puVar83);
        *puVar83 = 0;
      }
      uVar78 = uVar78 + 1;
      puVar83 = puVar83 + 4;
    } while (uVar78 < uVar82);
  }
  lStack_3d8 = 0;
  ImGui::MemFree(pvVar63);
  pvStack_3d0 = (void *)0x0;
LAB_001f04ab:
  _auStack_418 = (stbtt__buf)ZEXT816(0);
  lStack_3a8 = 0;
  pIStack_3a0 = (ImFontConfig *)0x0;
  uVar60 = (uint)auStack_4c8._0_8_;
  if ((int)uVar60 < 1) {
    auStack_418._0_4_ = uVar60;
    pvVar63 = (void *)0x0;
  }
  else {
    uVar82 = 8;
    if (8 < uVar60) {
      uVar82 = auStack_4c8._0_8_ & 0xffffffff;
    }
    pvVar63 = ImGui::MemAlloc(uVar82 << 4);
    pvStack_410 = pvVar63;
    auStack_418._4_4_ = (int)uVar82;
    uVar82 = 8;
    if (8 < uVar60) {
      uVar82 = auStack_4c8._0_8_ & 0xffffffff;
    }
    auStack_418._0_4_ = uVar60;
    pIStack_3a0 = (ImFontConfig *)ImGui::MemAlloc(uVar82 * 0x1c);
    lStack_3a8 = uVar82 << 0x20;
  }
  pIVar100 = pIStack_3a0;
  lStack_3a8 = CONCAT44(lStack_3a8._4_4_,uVar60);
  iVar81 = 0;
  memset(pvVar63,0,(long)(int)(uVar60 << 4));
  memset(pIVar100,0,(long)(int)(uVar60 * 0x1c));
  fVar117 = 0.0;
  if ((char)uStack_468 != '\0') {
    uVar78 = (ulong)(uint)auStack_488._0_4_;
    uVar82 = 0;
    iVar61 = 0;
    iVar93 = 0;
    uVar152 = SUB84(pvVar63,0);
    uVar176 = (undefined4)((ulong)pvVar63 >> 0x20);
    pIStack_398 = pIVar100;
    do {
      iVar62 = *(int *)((long)pvVar67 + uVar82 * 0x110 + 0xe8);
      if (iVar62 != 0) {
        psVar101 = (stbtt_fontinfo *)(uVar82 * 0x110 + (long)pvVar67);
        *(void **)&psVar101[1].hmtx = (void *)((long)iVar61 * 0x10 + (long)pvVar63);
        *(char **)&psVar101[1].gpos = pIVar100->Name + (long)iVar93 * 0x1c + -0x56;
        pIVar9 = (atlas->ConfigData).Data;
        fVar117 = pIVar9[uVar82].SizePixels;
        *(float *)&psVar101[1].userdata = fVar117;
        *(undefined4 *)((long)&psVar101[1].userdata + 4) = 0;
        psVar101[1].data = *(uchar **)&psVar101[1].gsubrs.cursor;
        iVar94 = *(int *)&psVar101[1].gsubrs.data;
        psVar101[1].fontstart = iVar94;
        *(char **)&psVar101[1].loca = pIVar100->Name + (long)iVar93 * 0x1c + -0x56;
        *(char *)&psVar101[1].glyf = (char)pIVar9[uVar82].OversampleH;
        *(char *)((long)&psVar101[1].glyf + 1) = (char)pIVar9[uVar82].OversampleV;
        if (fVar117 <= 0.0) {
          fVar117 = -fVar117;
          uVar60 = (uint)(ushort)(*(ushort *)(psVar101->data + (long)psVar101->head + 0x12) << 8 |
                                 *(ushort *)(psVar101->data + (long)psVar101->head + 0x12) >> 8);
        }
        else {
          puVar66 = psVar101->data;
          lVar99 = (long)psVar101->hhea;
          uVar60 = ((int)(short)((ushort)puVar66[lVar99 + 4] << 8) | (uint)puVar66[lVar99 + 5]) -
                   ((int)(short)((ushort)puVar66[lVar99 + 6] << 8) | (uint)puVar66[lVar99 + 7]);
        }
        fVar117 = fVar117 / (float)(int)uVar60;
        iVar61 = iVar61 + iVar62;
        iVar93 = iVar93 + iVar62;
        atlas = (ImFontAtlas *)auStack_4a8._8_8_;
        if (0 < iVar94) {
          auStack_458._0_4_ = iVar93;
          iVar93 = *(int *)(auStack_4a8._8_8_ + 0x14);
          lVar99 = 6;
          lVar84 = 0;
          uVar88 = uVar82;
          do {
            iVar62 = stbtt_FindGlyphIndex((stbtt_fontinfo *)psVar101->data,psVar101->index_map);
            stbtt_GetGlyphBitmapBoxSubpixel
                      (psVar101,iVar62,(float)pIVar9[uVar82].OversampleH * fVar117,
                       (float)pIVar9[uVar82].OversampleV * fVar117,fVar117,in_XMM3._0_4_,
                       (int *)asStack_238,(int *)auStack_4a8,(int *)&uStack_430,(int *)&sStack_4ac);
            uVar60 = (pIVar9[uVar82].OversampleH +
                     (((stbtt_uint32)uStack_430 + iVar93) - (int)asStack_238[0].data)) - 1;
            lVar79 = *(long *)&psVar101[1].hmtx;
            *(short *)(lVar79 + -2 + lVar99) = (short)uVar60;
            uVar96 = (pIVar9[uVar82].OversampleV + ((sStack_4ac + iVar93) - auStack_4a8._0_4_)) - 1;
            *(short *)(lVar79 + lVar99) = (short)uVar96;
            iVar81 = iVar81 + (uVar96 & 0xffff) * (uVar60 & 0xffff);
            lVar84 = lVar84 + 1;
            lVar99 = lVar99 + 0x10;
          } while (lVar84 < *(int *)&psVar101[1].gsubrs.data);
          pvVar63 = (void *)CONCAT44(uVar176,uVar152);
          uVar82 = uVar88;
          atlas = (ImFontAtlas *)auStack_4a8._8_8_;
          pIVar100 = pIStack_398;
          iVar93 = auStack_458._0_4_;
        }
      }
      uVar82 = uVar82 + 1;
    } while (uVar82 < uVar78);
    fVar117 = (float)iVar81;
  }
  atlas->TexHeight = 0;
  iVar81 = atlas->TexDesiredWidth;
  if (iVar81 < 1) {
    iVar93 = (int)SQRT(fVar117);
    iVar81 = 0x1000;
    if ((iVar93 < 0xb33) && (iVar81 = 0x800, iVar93 < 0x599)) {
      iVar81 = (uint)(0x2cb < iVar93) * 0x200 + 0x200;
    }
  }
  atlas->TexWidth = iVar81;
  uStack_4b0 = atlas->TexGlyphPadding;
  ptr = (stbrp_context *)ImGui::MemAlloc(0x48);
  uVar60 = iVar81 - uStack_4b0;
  ptr_00 = (stbrp_node *)ImGui::MemAlloc((long)(int)uVar60 << 4);
  auVar132 = _DAT_002a3960;
  auVar118 = _DAT_0022f730;
  if ((ptr == (stbrp_context *)0x0) || (ptr_00 == (stbrp_node *)0x0)) {
    if (ptr != (stbrp_context *)0x0) {
      ImGui::MemFree(ptr);
    }
    if (ptr_00 != (stbrp_node *)0x0) {
      ImGui::MemFree(ptr_00);
    }
    ptr_00 = (stbrp_node *)0x0;
    uStack_4b0 = 0;
    iVar81 = 0;
    ptr = (stbrp_context *)0x0;
  }
  else {
    uVar82 = (ulong)(uVar60 - 1);
    if ((int)uVar60 < 2) {
      uVar82 = 0;
    }
    else {
      uVar78 = (ulong)(uVar60 & 0x7ffffffe);
      lVar99 = uVar82 - 1;
      auVar104._8_4_ = (int)lVar99;
      auVar104._0_8_ = lVar99;
      auVar104._12_4_ = (int)((ulong)lVar99 >> 0x20);
      ppsVar90 = &ptr_00[1].next;
      auVar104 = auVar104 ^ _DAT_0022f730;
      auVar129._8_4_ = 0xffffffff;
      auVar129._0_8_ = 0xffffffffffffffff;
      auVar129._12_4_ = 0xffffffff;
      auVar166 = _DAT_0022f810;
      do {
        auVar134 = auVar166 ^ auVar118;
        auVar143._0_4_ = -(uint)(auVar104._0_4_ < auVar134._0_4_);
        auVar143._4_4_ = -(uint)(auVar104._4_4_ < auVar134._4_4_);
        auVar143._8_4_ = -(uint)(auVar104._8_4_ < auVar134._8_4_);
        auVar143._12_4_ = -(uint)(auVar104._12_4_ < auVar134._12_4_);
        auVar135._4_4_ = -(uint)(auVar134._4_4_ == auVar104._4_4_);
        auVar135._12_4_ = -(uint)(auVar134._12_4_ == auVar104._12_4_);
        auVar135._0_4_ = auVar135._4_4_;
        auVar135._8_4_ = auVar135._12_4_;
        auVar144._4_4_ = auVar143._4_4_;
        auVar144._0_4_ = auVar143._4_4_;
        auVar144._8_4_ = auVar143._12_4_;
        auVar144._12_4_ = auVar143._12_4_;
        auVar144 = auVar144 | auVar135 & auVar143;
        lVar99 = auVar166._8_8_;
        if ((~auVar144._0_4_ & 1) != 0) {
          ppsVar90[-2] = ptr_00 + auVar166._0_8_ + 1;
        }
        if (((auVar144 ^ auVar129) & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *ppsVar90 = ptr_00 + (lVar99 - auVar129._8_8_);
        }
        auVar166._0_8_ = auVar166._0_8_ + auVar132._0_8_;
        auVar166._8_8_ = lVar99 + auVar132._8_8_;
        ppsVar90 = ppsVar90 + 4;
        uVar78 = uVar78 - 2;
      } while (uVar78 != 0);
    }
    ptr_00[uVar82].next = (stbrp_node *)0x0;
    ptr->init_mode = 1;
    ptr->heuristic = 0;
    ptr->free_head = ptr_00;
    ptr->active_head = ptr->extra;
    ptr->width = uVar60;
    ptr->height = 0x8000 - uStack_4b0;
    ptr->num_nodes = uVar60;
    ptr->align = (int)((uVar60 - 1) + uVar60) / (int)uVar60;
    ptr->extra[0].x = 0;
    ptr->extra[0].y = 0;
    ptr->extra[0].next = ptr->extra + 1;
    ptr->extra[1].x = (stbrp_coord)uVar60;
    ptr->extra[1].y = 0xffff;
    ptr->extra[1].next = (stbrp_node *)0x0;
  }
  psStack_340 = ptr;
  ImFontAtlasBuildPackCustomRects(atlas,ptr);
  if ((char)uStack_468 != '\0') {
    uVar82 = (ulong)(uint)auStack_488._0_4_;
    uVar78 = 0;
    do {
      lVar99 = uVar78 * 0x110;
      iVar93 = *(int *)((long)pvVar67 + lVar99 + 0xe8);
      if (iVar93 != 0) {
        stbrp_pack_rects(psStack_340,*(stbrp_rect **)((long)pvVar67 + lVar99 + 200),iVar93);
        lVar84 = (long)*(int *)((long)pvVar67 + lVar99 + 0xe8);
        if (0 < lVar84) {
          lVar99 = *(long *)((long)pvVar67 + lVar99 + 200);
          lVar79 = 0;
          do {
            if (*(int *)(lVar99 + 0xc + lVar79) != 0) {
              iVar93 = (uint)*(ushort *)(lVar99 + 6 + lVar79) +
                       (uint)*(ushort *)(lVar99 + 10 + lVar79);
              if (iVar93 < atlas->TexHeight) {
                iVar93 = atlas->TexHeight;
              }
              atlas->TexHeight = iVar93;
            }
            lVar79 = lVar79 + 0x10;
          } while (lVar84 * 0x10 != lVar79);
        }
      }
      uVar78 = uVar78 + 1;
    } while (uVar78 < uVar82);
  }
  uVar60 = atlas->TexHeight;
  if ((atlas->Flags & 1) == 0) {
    uVar60 = (int)(uVar60 - 1) >> 1 | uVar60 - 1;
    uVar60 = (int)uVar60 >> 2 | uVar60;
    uVar60 = (int)uVar60 >> 4 | uVar60;
    uVar60 = (int)uVar60 >> 8 | uVar60;
    uVar60 = (int)uVar60 >> 0x10 | uVar60;
  }
  iVar93 = uVar60 + 1;
  atlas->TexHeight = iVar93;
  auVar105._0_4_ = (float)atlas->TexWidth;
  auVar105._4_4_ = (float)iVar93;
  auVar105._8_8_ = 0;
  auVar118 = divps(_DAT_00245cd0,auVar105);
  atlas->TexUvScale = auVar118._0_8_;
  puVar66 = (uchar *)ImGui::MemAlloc((long)(iVar93 * atlas->TexWidth));
  atlas->TexPixelsAlpha8 = puVar66;
  iStack_45c = iVar81;
  psStack_300 = ptr_00;
  memset(puVar66,0,(long)atlas->TexHeight * (long)atlas->TexWidth);
  if ((char)uStack_468 != '\0') {
    puStack_388 = atlas->TexPixelsAlpha8;
    lVar84 = (long)iStack_45c;
    auStack_298 = pshuflw(ZEXT416(uStack_4b0),ZEXT416(uStack_4b0),0);
    lVar99 = 0;
    auVar134 = _DAT_0022f730;
    auVar132 = _DAT_002a98e0;
    auVar118 = _DAT_002a98c0;
    do {
      lStack_338 = lVar99;
      if (*(int *)((long)pvStack_400 + lVar99 * 0x110 + 0xe8) != 0) {
        psVar101 = (stbtt_fontinfo *)((long)pvStack_400 + lVar99 * 0x110);
        fVar117 = *(float *)&psVar101[1].userdata;
        if (fVar117 <= 0.0) {
          auVar125._4_4_ = auVar134._4_4_;
          auVar125._0_4_ = (uint)fVar117 ^ auVar134._0_4_;
          auVar125._8_4_ = auVar134._8_4_;
          auVar125._12_4_ = auVar134._12_4_;
          uVar60 = (uint)(ushort)(*(ushort *)(psVar101->data + (long)psVar101->head + 0x12) << 8 |
                                 *(ushort *)(psVar101->data + (long)psVar101->head + 0x12) >> 8);
        }
        else {
          puVar66 = psVar101->data;
          lVar99 = (long)psVar101->hhea;
          uVar60 = ((int)(short)((ushort)puVar66[lVar99 + 4] << 8) | (uint)puVar66[lVar99 + 5]) -
                   ((int)(short)((ushort)puVar66[lVar99 + 6] << 8) | (uint)puVar66[lVar99 + 7]);
          auVar125 = ZEXT416((uint)fVar117);
        }
        auStack_318._4_12_ = auVar125._4_12_;
        auStack_318._0_4_ = auVar125._0_4_ / (float)(int)uVar60;
        pIStack_2f8 = (atlas->ConfigData).Data;
        iVar81 = psVar101[1].fontstart;
        if (0 < iVar81) {
          lVar99._0_4_ = psVar101[1].hmtx;
          lVar99._4_4_ = psVar101[1].kern;
          uVar82._0_4_ = psVar101[1].glyf;
          uVar82._4_4_ = psVar101[1].hhea;
          auVar24._8_6_ = 0;
          auVar24._0_8_ = uVar82;
          auVar24[0xe] = (char)((uint)uVar82._4_4_ >> 0x18);
          auVar26._8_4_ = 0;
          auVar26._0_8_ = uVar82;
          auVar26[0xc] = (char)((uint)uVar82._4_4_ >> 0x10);
          auVar26._13_2_ = auVar24._13_2_;
          auVar27._8_4_ = 0;
          auVar27._0_8_ = uVar82;
          auVar27._12_3_ = auVar26._12_3_;
          auVar28._8_2_ = 0;
          auVar28._0_8_ = uVar82;
          auVar28[10] = (char)((uint)uVar82._4_4_ >> 8);
          auVar28._11_4_ = auVar27._11_4_;
          auVar31._8_2_ = 0;
          auVar31._0_8_ = uVar82;
          auVar31._10_5_ = auVar28._10_5_;
          auVar32[8] = (char)uVar82._4_4_;
          auVar32._0_8_ = uVar82;
          auVar32._9_6_ = auVar31._9_6_;
          auVar35._7_8_ = 0;
          auVar35._0_7_ = auVar32._8_7_;
          cVar114 = (char)((uint)(undefined4)uVar82 >> 0x18);
          Var36 = CONCAT81(SUB158(auVar35 << 0x40,7),cVar114);
          auVar43._9_6_ = 0;
          auVar43._0_9_ = Var36;
          cVar112 = (char)((uint)(undefined4)uVar82 >> 0x10);
          auVar33[4] = cVar112;
          auVar33._0_4_ = (undefined4)uVar82;
          auVar33._5_10_ = SUB1510(auVar43 << 0x30,5);
          auVar37._11_4_ = 0;
          auVar37._0_11_ = auVar33._4_11_;
          cVar111 = (char)((uint)(undefined4)uVar82 >> 8);
          auVar38._1_12_ = SUB1512(auVar37 << 0x20,3);
          auVar38[0] = cVar111;
          bVar103 = (byte)(undefined4)uVar82;
          uVar50 = CONCAT11(0,bVar103);
          auVar34._2_13_ = auVar38;
          auVar34._0_2_ = uVar50;
          uVar113 = auVar38._0_2_;
          sVar72 = -auVar33._4_2_;
          sVar115 = (short)Var36;
          sVar52 = -sVar115;
          uStack_498 = (ulong)uVar113;
          auVar25._10_2_ = 0;
          auVar25._0_10_ = auVar34._0_10_;
          auVar25._12_2_ = sVar115;
          uVar45 = CONCAT42(auVar25._10_4_,auVar33._4_2_);
          auVar39._6_8_ = 0;
          auVar39._0_6_ = uVar45;
          auVar29._4_2_ = uVar113;
          auVar29._0_4_ = auVar34._0_4_;
          auVar29._6_8_ = SUB148(auVar39 << 0x40,6);
          auVar106._0_4_ = (float)uVar50;
          auVar106._4_4_ = (float)auVar29._4_4_;
          auVar106._8_4_ = (float)(int)uVar45;
          auVar106._12_4_ = (float)(auVar25._10_4_ >> 0x10);
          auStack_268 = divps(_DAT_00245cd0,auVar106);
          auVar136[0] = -(bVar103 == 0);
          auVar136[1] = -(bVar103 == 0);
          auVar136[2] = -(bVar103 == 0);
          auVar136[3] = -(bVar103 == 0);
          auVar136[4] = -(cVar111 == '\0');
          auVar136[5] = -(cVar111 == '\0');
          auVar136[6] = -(cVar111 == '\0');
          auVar136[7] = -(cVar111 == '\0');
          auVar136[8] = -(cVar112 == '\0');
          auVar136[9] = -(cVar112 == '\0');
          auVar136[10] = -(cVar112 == '\0');
          auVar136[0xb] = -(cVar112 == '\0');
          auVar136[0xc] = -(cVar114 == '\0');
          auVar136[0xd] = -(cVar114 == '\0');
          auVar136[0xe] = -(cVar114 == '\0');
          auVar136[0xf] = -(cVar114 == '\0');
          Var44 = CONCAT64(CONCAT42(CONCAT22(sVar52,sVar52),sVar72),CONCAT22(sVar72,sVar52));
          auVar40._4_8_ = (long)((unkuint10)Var44 >> 0x10);
          auVar40._2_2_ = 1 - uVar113;
          auVar40._0_2_ = 1 - uVar113;
          auVar119._0_4_ = (float)(int)(short)(1 - uVar50);
          auVar119._4_4_ = (float)(auVar40._0_4_ >> 0x10);
          auVar119._8_4_ = (float)((int)((unkuint10)Var44 >> 0x10) >> 0x10);
          auVar119._12_4_ = (float)(int)sVar52;
          auVar130._0_4_ = (float)auStack_318._0_4_ * auVar106._0_4_;
          auVar130._4_4_ = (float)auStack_318._0_4_ * auVar106._4_4_;
          auVar130._8_4_ = (float)auStack_318._0_4_ * auVar106._8_4_;
          auVar130._12_4_ = (float)auStack_318._0_4_ * auVar106._12_4_;
          auVar107._0_4_ = auVar106._0_4_ + auVar106._0_4_;
          auVar107._4_4_ = auVar106._4_4_ + auVar106._4_4_;
          auVar107._8_4_ = auVar106._8_4_ + auVar106._8_4_;
          auVar107._12_4_ = auVar106._12_4_ + auVar106._12_4_;
          auVar134 = divps(auVar119,auVar107);
          fVar117 = auVar130._4_4_;
          if (auVar130._0_4_ <= auVar130._4_4_) {
            fVar117 = auVar130._0_4_;
          }
          fStack_3dc = (0.35 / fVar117) * (0.35 / fVar117);
          fStack_2b8 = auVar130._4_4_;
          fStack_2b4 = auVar130._4_4_;
          fStack_2b0 = auVar130._4_4_;
          fStack_2ac = auVar130._4_4_;
          uVar60 = (uint)auVar130._4_4_ ^ (uint)DAT_0022f730;
          uStack_328 = (ulong)((undefined4)uVar82 & 0xff);
          uStack_320 = (ulong)((uint)(undefined4)uVar82 >> 8 & 0xff);
          auVar126._4_4_ = auStack_268._4_4_;
          auVar126._0_4_ = auVar126._4_4_;
          auVar126._8_4_ = auVar126._4_4_;
          auVar126._12_4_ = auVar126._4_4_;
          auStack_278 = auVar126;
          auStack_258 = ~auVar136 & auVar134;
          auStack_288._4_4_ = SUB164(~auVar136 & auVar134,4);
          auStack_288._0_4_ = auStack_288._4_4_;
          auStack_288._8_4_ = auStack_288._4_4_;
          auStack_288._12_4_ = auStack_288._4_4_;
          uStack_3e8 = (ulong)(auVar34._0_4_ & 0xff);
          auStack_2a8 = auVar130;
          auStack_248._4_4_ = uVar60;
          auStack_248._0_4_ = auVar130._0_4_;
          fStack_240 = auVar130._0_4_;
          fStack_23c = (float)uVar60;
          lVar79 = 0;
          lStack_2d8 = lVar99;
          psStack_3c0 = psVar101;
          auVar134 = _DAT_0022f730;
          do {
            fVar117 = auVar126._0_4_;
            if (*(int *)(lVar99 + 0xc + lVar79 * 0x10) != 0) {
              lVar77 = lVar79 * 0x10 + lVar99;
              sVar72 = *(short *)(lVar77 + 4);
              if ((sVar72 != 0) && (sVar52 = *(short *)(lVar77 + 6), sVar52 != 0)) {
                psStack_2d0 = (short *)(lVar79 * 0x1c + *(long *)&psVar101[1].loca);
                info = (stbtt_fontinfo *)psVar101->data;
                lStack_3b0 = lVar77;
                lStack_2c8 = lVar79;
                iVar93 = stbtt_FindGlyphIndex(info,psVar101->index_map);
                lVar99 = lStack_3b0;
                *(uint *)(lStack_3b0 + 8) =
                     CONCAT22((short)((uint)*(undefined4 *)(lStack_3b0 + 8) >> 0x10) +
                              auStack_298._2_2_,
                              (short)*(undefined4 *)(lStack_3b0 + 8) + auStack_298._0_2_);
                *(short *)(lStack_3b0 + 4) = sVar72 - (short)uStack_4b0;
                *(short *)(lStack_3b0 + 6) = sVar52 - (short)uStack_4b0;
                uVar50 = *(ushort *)((long)&info->glyf + (long)psVar101->hhea + 2);
                uVar50 = uVar50 << 8 | uVar50 >> 8;
                iVar81 = psVar101->hmtx;
                pbVar91 = (byte *)((long)info + (ulong)uVar50 * 4 + (long)iVar81 + -4);
                pbVar102 = (byte *)((long)info + (ulong)uVar50 * 4 + (long)iVar81 + -3);
                if (iVar93 < (int)(uint)uVar50) {
                  pbVar91 = (byte *)((long)&info->userdata + (long)(iVar93 * 4) + (long)iVar81);
                  pbVar102 = (byte *)((long)&info->userdata + (long)(iVar93 * 4) + 1 + (long)iVar81)
                  ;
                }
                uStack_358 = (uint)*pbVar102;
                uStack_354 = (uint)*pbVar91;
                stbtt_GetGlyphBitmapBoxSubpixel
                          (psVar101,iVar93,(float)auStack_2a8._0_4_,fStack_2b8,fVar117,
                           auVar130._0_4_,&iStack_348,&iStack_34c,&iStack_2bc,&iStack_2c0);
                uVar50 = *(ushort *)(lVar99 + 8);
                puStack_370 = (uchar *)(ulong)*(ushort *)(lVar99 + 10);
                uStack_438 = (ulong)*(ushort *)(lVar99 + 4);
                uStack_3f8 = (ulong)*(ushort *)(lVar99 + 6);
                uVar60 = stbtt_GetGlyphShape(psVar101,iVar93,(stbtt_vertex **)&uStack_430);
                fVar97 = (float)(((int)uStack_438 - (int)uStack_3e8) + 1);
                stbtt_GetGlyphBitmapBoxSubpixel
                          (psStack_3c0,iVar93,(float)auStack_2a8._0_4_,fStack_2b8,fVar117,
                           auVar130._0_4_,(int *)&sStack_4ac,&iStack_344,(int *)0x0,(int *)0x0);
                sVar59 = sStack_4ac;
                fStack_48c = fVar97;
                if (fVar97 != 0.0) {
                  iVar81 = ((int)uStack_3f8 - (int)uStack_498) + 1;
                  if ((iVar81 != 0) && (0 < (int)uVar60)) {
                    puStack_370 = puStack_388 + (long)puStack_370 * lVar84 + (ulong)uVar50;
                    uStack_438 = (ulong)(uint)((int)uStack_438 - (int)uStack_3e8);
                    uStack_3f8 = (ulong)(uint)((int)uStack_3f8 - (int)uStack_498);
                    lVar99 = CONCAT44(uStack_430._4_4_,(stbtt_uint32)uStack_430);
                    iStack_424 = iStack_344;
                    lVar79 = 0;
                    uVar96 = 0;
                    do {
                      uVar96 = uVar96 + (*(char *)(lVar99 + 0xc + lVar79) == '\x01');
                      lVar79 = lVar79 + 0xe;
                    } while ((ulong)uVar60 * 0xe != lVar79);
                    if (uVar96 != 0) {
                      uVar152 = 0;
                      pvStack_440 = ImGui::MemAlloc((ulong)uVar96 * 4);
                      if (pvStack_440 != (void *)0x0) {
                        bVar71 = false;
                        iVar61 = 0;
                        auVar41._8_8_ = 0;
                        auVar41._0_8_ = auStack_458._8_8_;
                        auStack_458 = auVar41 << 0x40;
                        iVar93 = 0;
                        bVar49 = true;
                        do {
                          bVar80 = bVar49;
                          if (bVar71) {
                            pvVar67 = ImGui::MemAlloc((long)iVar93 << 3);
                            auStack_458._0_8_ = pvVar67;
                            if (pvVar67 == (void *)0x0) {
                              ImGui::MemFree((void *)0x0);
                              ImGui::MemFree(pvStack_440);
                              goto LAB_001f1e86;
                            }
                          }
                          asStack_238[0].data =
                               (uchar *)((ulong)asStack_238[0].data & 0xffffffff00000000);
                          fVar117 = 0.0;
                          fVar97 = 0.0;
                          uVar82 = 0xffffffff;
                          lVar79 = 0;
                          do {
                            iVar93 = (int)asStack_238[0].data;
                            switch(*(undefined1 *)(lVar99 + 0xc + lVar79)) {
                            case 1:
                              if (-1 < (int)uVar82) {
                                *(int *)((long)pvStack_440 + uVar82 * 4) =
                                     (int)asStack_238[0].data - iVar61;
                              }
                              uVar82 = (ulong)((int)uVar82 + 1);
                              auVar118 = pshuflw(ZEXT416(*(uint *)(lVar99 + lVar79)),
                                                 ZEXT416(*(uint *)(lVar99 + lVar79)),0x60);
                              fVar117 = (float)(auVar118._0_4_ >> 0x10);
                              fVar97 = (float)(auVar118._4_4_ >> 0x10);
                              asStack_238[0].data =
                                   (uchar *)CONCAT44(asStack_238[0].data._4_4_,
                                                     (int)asStack_238[0].data + 1);
                              iVar61 = iVar93;
                              if ((stbtt__point *)auStack_458._0_8_ != (stbtt__point *)0x0) {
                                ((stbtt__point *)(auStack_458._0_8_ + (long)iVar93 * 8))->x =
                                     fVar117;
                                ((stbtt__point *)(auStack_458._0_8_ + (long)iVar93 * 8))->y = fVar97
                                ;
                              }
                              break;
                            case 2:
                              lVar77 = (long)(int)asStack_238[0].data;
                              auVar118 = pshuflw(ZEXT416(*(uint *)(lVar99 + lVar79)),
                                                 ZEXT416(*(uint *)(lVar99 + lVar79)),0x60);
                              fVar117 = (float)(auVar118._0_4_ >> 0x10);
                              fVar97 = (float)(auVar118._4_4_ >> 0x10);
                              asStack_238[0].data =
                                   (uchar *)CONCAT44(asStack_238[0].data._4_4_,
                                                     (int)asStack_238[0].data + 1);
                              if ((stbtt__point *)auStack_458._0_8_ != (stbtt__point *)0x0) {
                                ((stbtt__point *)(auStack_458._0_8_ + lVar77 * 8))->x = fVar117;
                                ((stbtt__point *)(auStack_458._0_8_ + lVar77 * 8))->y = fVar97;
                              }
                              break;
                            case 3:
                              fVar139 = (float)(int)*(short *)(lVar99 + 6 + lVar79);
                              auVar130 = ZEXT416((uint)fVar139);
                              stbtt__tesselate_curve
                                        ((stbtt__point *)auStack_458._0_8_,(int *)asStack_238,
                                         fVar117,fVar97,(float)(int)*(short *)(lVar99 + 4 + lVar79),
                                         fVar139,(float)(int)*(short *)(lVar99 + lVar79),
                                         (float)(int)*(short *)(lVar99 + 2 + lVar79),fStack_3dc,0);
                              goto LAB_001f11e7;
                            case 4:
                              fVar139 = (float)(int)*(short *)(lVar99 + 6 + lVar79);
                              auVar130 = ZEXT416((uint)fVar139);
                              stbtt__tesselate_cubic
                                        ((stbtt__point *)auStack_458._0_8_,(int *)asStack_238,
                                         fVar117,fVar97,(float)(int)*(short *)(lVar99 + 4 + lVar79),
                                         fVar139,(float)(int)*(short *)(lVar99 + 8 + lVar79),
                                         (float)(int)*(short *)(lVar99 + 10 + lVar79),
                                         (float)(int)*(short *)(lVar99 + lVar79),
                                         (float)(int)*(short *)(lVar99 + 2 + lVar79),fStack_3dc,0);
LAB_001f11e7:
                              auVar118 = pshuflw(ZEXT416(*(uint *)(lVar99 + lVar79)),
                                                 ZEXT416(*(uint *)(lVar99 + lVar79)),0x60);
                              fVar117 = (float)(auVar118._0_4_ >> 0x10);
                              fVar97 = (float)(auVar118._4_4_ >> 0x10);
                            }
                            lVar79 = lVar79 + 0xe;
                          } while ((ulong)uVar60 * 0xe != lVar79);
                          *(int *)((long)pvStack_440 + (long)(int)uVar82 * 4) =
                               (int)asStack_238[0].data - iVar61;
                          bVar71 = true;
                          iVar93 = (int)asStack_238[0].data;
                          bVar49 = false;
                        } while (bVar80);
                        pvVar67 = (void *)auStack_458._0_8_;
                        if ((void *)auStack_458._0_8_ != (void *)0x0) {
                          lVar99 = 0;
                          lVar79 = 0;
                          do {
                            lVar79 = (long)(int)lVar79 +
                                     (long)*(int *)((long)pvStack_440 + lVar99 * 4);
                            lVar99 = lVar99 + 1;
                          } while (CONCAT44(uVar152,uVar96) != lVar99);
                          psStack_470 = (stbtt__edge *)ImGui::MemAlloc(lVar79 * 0x14 + 0x14);
                          if (psStack_470 != (stbtt__edge *)0x0) {
                            lVar99 = 0;
                            uVar60 = 0;
                            iVar93 = 0;
                            do {
                              iVar61 = *(int *)((long)pvStack_440 + lVar99 * 4);
                              if (0 < iVar61) {
                                lVar79 = auStack_458._0_8_ + (long)iVar93 * 8;
                                uVar78 = (ulong)(iVar61 - 1);
                                uVar82 = 0;
                                iVar62 = iVar61;
                                do {
                                  iVar94 = (int)uVar78;
                                  fVar117 = *(float *)(lVar79 + 4 + (long)iVar94 * 8);
                                  fVar97 = *(float *)((long)pvVar67 +
                                                     uVar82 * 8 + (long)iVar93 * 8 + 4);
                                  if ((fVar117 != fVar97) || (NAN(fVar117) || NAN(fVar97))) {
                                    iVar95 = (int)uVar82;
                                    iVar62 = iVar94;
                                    if (fVar117 <= fVar97) {
                                      iVar62 = iVar95;
                                      iVar95 = iVar94;
                                    }
                                    psStack_470[(int)uVar60].invert = (uint)(fVar97 < fVar117);
                                    uVar154 = *(undefined8 *)(lVar79 + (long)iVar62 * 8);
                                    uVar178 = *(undefined8 *)(lVar79 + (long)iVar95 * 8);
                                    psVar86 = psStack_470 + (int)uVar60;
                                    psVar86->x0 = (float)uVar154 * (float)auStack_248._0_4_ + 0.0;
                                    psVar86->y0 = (float)((ulong)uVar154 >> 0x20) *
                                                  (float)auStack_248._4_4_ + 0.0;
                                    psVar86->x1 = (float)uVar178 * fStack_240 + 0.0;
                                    psVar86->y1 = (float)((ulong)uVar178 >> 0x20) * fStack_23c + 0.0
                                    ;
                                    uVar60 = uVar60 + 1;
                                    iVar62 = *(int *)((long)pvStack_440 + lVar99 * 4);
                                  }
                                  uVar78 = uVar82 & 0xffffffff;
                                  uVar82 = uVar82 + 1;
                                } while ((long)uVar82 < (long)iVar62);
                              }
                              iVar93 = iVar93 + iVar61;
                              lVar99 = lVar99 + 1;
                            } while (lVar99 != CONCAT44(uVar152,uVar96));
                            stbtt__sort_edges_quicksort(psStack_470,uVar60);
                            iVar93 = (int)uStack_438;
                            if (1 < (int)uVar60) {
                              uVar82 = 1;
                              lVar99 = 2;
                              psVar86 = psStack_470;
                              do {
                                uVar2 = psStack_470[uVar82].x0;
                                uVar3 = psStack_470[uVar82].y0;
                                iVar61 = psStack_470[uVar82].invert;
                                asStack_238[0].cursor = iVar61;
                                asStack_238[0].data = *(uchar **)&psStack_470[uVar82].x1;
                                lVar79 = lVar99;
                                psVar92 = psVar86;
                                do {
                                  if (psVar92->y0 <= (float)uVar3) {
                                    uVar96 = (int)lVar79 - 1;
                                    goto LAB_001f1445;
                                  }
                                  psVar92[1].invert = psVar92->invert;
                                  fVar117 = psVar92->y0;
                                  fVar97 = psVar92->x1;
                                  fVar139 = psVar92->y1;
                                  psVar92[1].x0 = psVar92->x0;
                                  psVar92[1].y0 = fVar117;
                                  psVar92[1].x1 = fVar97;
                                  psVar92[1].y1 = fVar139;
                                  lVar79 = lVar79 + -1;
                                  psVar92 = psVar92 + -1;
                                } while (1 < lVar79);
                                uVar96 = 0;
LAB_001f1445:
                                if (uVar82 != uVar96) {
                                  psStack_470[(int)uVar96].x0 = (float)uVar2;
                                  psStack_470[(int)uVar96].y0 = (float)uVar3;
                                  *(uchar **)&psStack_470[(int)uVar96].x1 = asStack_238[0].data;
                                  psStack_470[(int)uVar96].invert = iVar61;
                                }
                                uVar82 = uVar82 + 1;
                                lVar99 = lVar99 + 1;
                                psVar86 = psVar86 + 1;
                              } while (uVar82 != uVar60);
                            }
                            auStack_4a8._0_8_ = (stbtt__active_edge *)0x0;
                            scanline = asStack_238;
                            if (0x3f < iVar93) {
                              scanline = (stbtt__buf *)
                                         ImGui::MemAlloc((ulong)(uint)fStack_48c * 8 + 4);
                              iVar93 = (int)uStack_438;
                            }
                            psStack_470[(int)uVar60].y0 = (float)(iVar81 + iStack_424) + 1.0;
                            if ((uint)uStack_3f8 < 0x7fffffff) {
                              lStack_2f0 = (long)(int)fStack_48c;
                              fStack_350 = (float)(int)sVar59;
                              pfStack_368 = (float *)((long)&scanline->data + lStack_2f0 * 4);
                              pfStack_330 = pfStack_368 + 1;
                              sStack_2e0 = lStack_2f0 * 4;
                              sStack_2e8 = (long)iVar93 * 4 + 8;
                              fStack_41c = (float)(int)fStack_48c;
                              uStack_380 = 0;
                              psVar70 = (stbtt__active_edge *)0x0;
                              uStack_378 = 0;
                              puStack_3b8 = (undefined8 *)0x0;
                              iStack_420 = 0;
                              psStack_3f0 = (stbtt__active_edge *)0x0;
                              psVar86 = psStack_470;
                              iVar81 = iStack_424;
                              do {
                                iStack_35c = iVar81;
                                iVar81 = iStack_424;
                                fVar97 = (float)iStack_35c;
                                fVar117 = fVar97 + 1.0;
                                memset(scanline,0,sStack_2e0);
                                memset(pfStack_368,0,sStack_2e8);
                                if (psVar70 != (stbtt__active_edge *)0x0) {
                                  psVar68 = (stbtt__active_edge *)auStack_4a8;
                                  do {
                                    if (psVar70->ey <= fVar97) {
                                      psVar68->next = psVar70->next;
                                      psVar70->direction = 0.0;
                                      psVar70->next = psStack_3f0;
                                      psStack_3f0 = psVar70;
                                      psVar70 = psVar68;
                                    }
                                    ppsVar48 = &psVar70->next;
                                    psVar68 = psVar70;
                                    psVar70 = *ppsVar48;
                                  } while (*ppsVar48 != (stbtt__active_edge *)0x0);
                                }
                                fVar139 = psVar86->y0;
                                psVar70 = psStack_3f0;
                                iVar93 = iStack_420;
                                if (fVar139 <= fVar117) {
                                  bVar49 = (int)uStack_378 == 0;
                                  do {
                                    fVar140 = psVar86->y1;
                                    if ((fVar139 != fVar140) || (NAN(fVar139) || NAN(fVar140))) {
                                      if (psVar70 == (stbtt__active_edge *)0x0) {
                                        if (iVar93 == 0) {
                                          puVar83 = (undefined8 *)ImGui::MemAlloc(0x6408);
                                          if (puVar83 == (undefined8 *)0x0) {
                                            psVar70 = (stbtt__active_edge *)0x0;
                                            iVar93 = 0;
                                            goto LAB_001f1def;
                                          }
                                          *puVar83 = puStack_3b8;
                                          fVar139 = psVar86->y0;
                                          fVar140 = psVar86->y1;
                                          iVar93 = 799;
                                          puStack_3b8 = puVar83;
                                        }
                                        else {
                                          iVar93 = iVar93 + -1;
                                        }
                                        psVar70 = (stbtt__active_edge *)
                                                  (puStack_3b8 + (long)iVar93 * 4 + 1);
                                        psVar68 = (stbtt__active_edge *)0x0;
                                      }
                                      else {
                                        psVar68 = psVar70->next;
                                      }
                                      fVar141 = psVar86->x0;
                                      fVar142 = (psVar86->x1 - fVar141) / (fVar140 - fVar139);
                                      psVar70->fdx = fVar142;
                                      psVar70->fdy = (float)(-(uint)(fVar142 != 0.0) &
                                                            (uint)(1.0 / fVar142));
                                      psVar70->fx = ((fVar97 - fVar139) * fVar142 + fVar141) -
                                                    fStack_350;
                                      psVar70->direction =
                                           *(float *)(&DAT_002a7cd4 +
                                                     (ulong)(psVar86->invert == 0) * 4);
                                      psVar70->sy = fVar139;
                                      psVar70->ey = fVar140;
                                      psVar70->next = (stbtt__active_edge *)0x0;
                                      if (fVar140 < fVar97 && (bVar49 && iVar81 != 0)) {
                                        psVar70->ey = fVar97;
                                      }
                                      psVar70->next = (stbtt__active_edge *)auStack_4a8._0_8_;
                                      auStack_4a8._0_8_ = psVar70;
                                      psVar70 = psVar68;
                                    }
LAB_001f1def:
                                    fVar139 = psVar86[1].y0;
                                    psVar86 = psVar86 + 1;
                                  } while (fVar139 <= fVar117);
                                }
                                psStack_3f0 = psVar70;
                                iStack_420 = iVar93;
                                psVar70 = (stbtt__active_edge *)auStack_4a8._0_8_;
                                puVar83 = puStack_3b8;
                                for (psVar68 = (stbtt__active_edge *)auStack_4a8._0_8_;
                                    auStack_4a8._0_8_ = psVar70, puStack_3b8 = puVar83,
                                    psVar68 != (stbtt__active_edge *)0x0; psVar68 = psVar68->next) {
                                  fVar139 = psVar68->fx;
                                  fVar140 = psVar68->fdx;
                                  if ((fVar140 != 0.0) || (NAN(fVar140))) {
                                    fVar147 = fVar140 + fVar139;
                                    fVar141 = psVar68->sy;
                                    fVar142 = (float)(~-(uint)(fVar97 < fVar141) & (uint)fVar139 |
                                                     (uint)((fVar141 - fVar97) * fVar140 + fVar139)
                                                     & -(uint)(fVar97 < fVar141));
                                    if (0.0 <= fVar142) {
                                      fVar148 = psVar68->ey;
                                      fVar150 = (float)(-(uint)(fVar148 < fVar117) &
                                                        (uint)((fVar148 - fVar97) * fVar140 +
                                                              fVar139) |
                                                       ~-(uint)(fVar148 < fVar117) & (uint)fVar147);
                                      if (((0.0 <= fVar150) && (fVar142 < fStack_41c)) &&
                                         (fVar150 < fStack_41c)) {
                                        if (fVar141 <= fVar97) {
                                          fVar141 = fVar97;
                                        }
                                        iVar81 = (int)fVar142;
                                        if (fVar117 <= fVar148) {
                                          fVar148 = fVar117;
                                        }
                                        iVar93 = (int)fVar150;
                                        if (iVar81 == iVar93) {
                                          lVar99 = (long)iVar81;
                                          *(float *)((long)&scanline->data + lVar99 * 4) =
                                               (((fVar150 - (float)iVar81) +
                                                (fVar142 - (float)iVar81)) * -0.5 + 1.0) *
                                               psVar68->direction * (fVar148 - fVar141) +
                                               *(float *)((long)&scanline->data + lVar99 * 4);
                                          fVar139 = (fVar148 - fVar141) * psVar68->direction;
                                        }
                                        else {
                                          fVar140 = psVar68->fdy;
                                          iVar61 = iVar81;
                                          fVar151 = fVar142;
                                          if (fVar150 < fVar142) {
                                            fVar160 = fVar97 - fVar141;
                                            fVar141 = (fVar97 - fVar148) + fVar117;
                                            fVar140 = -fVar140;
                                            iVar61 = iVar93;
                                            iVar93 = iVar81;
                                            fVar139 = fVar147;
                                            fVar151 = fVar150;
                                            fVar150 = fVar142;
                                            fVar148 = fVar160 + fVar117;
                                          }
                                          iVar81 = iVar61 + 1;
                                          fVar147 = ((float)iVar81 - fVar139) * fVar140 + fVar97;
                                          fVar139 = psVar68->direction;
                                          fVar142 = (fVar147 - fVar141) * fVar139;
                                          lVar99 = (long)iVar61;
                                          *(float *)((long)&scanline->data + lVar99 * 4) =
                                               (((fVar151 - (float)iVar61) + 1.0) * -0.5 + 1.0) *
                                               fVar142 + *(float *)((long)&scanline->data +
                                                                   lVar99 * 4);
                                          if (iVar93 - iVar81 != 0 && iVar81 <= iVar93) {
                                            do {
                                              *(float *)((long)&scanline->data + lVar99 * 4 + 4) =
                                                   fVar140 * fVar139 * 0.5 + fVar142 +
                                                   *(float *)((long)&scanline->data + lVar99 * 4 + 4
                                                             );
                                              fVar142 = fVar142 + fVar140 * fVar139;
                                              lVar99 = lVar99 + 1;
                                            } while (iVar93 + -1 != (int)lVar99);
                                          }
                                          lVar99 = (long)iVar93;
                                          *(float *)((long)&scanline->data + lVar99 * 4) =
                                               (fVar148 -
                                               (fVar140 * (float)(iVar93 - iVar81) + fVar147)) *
                                               (((fVar150 - (float)iVar93) + 0.0) * -0.5 + 1.0) *
                                               fVar139 + fVar142 +
                                               *(float *)((long)&scanline->data + lVar99 * 4);
                                          fVar139 = (fVar148 - fVar141) * fVar139;
                                        }
                                        pfStack_330[lVar99] = fVar139 + pfStack_330[lVar99];
                                        goto LAB_001f1ba5;
                                      }
                                    }
                                    if ((uint)uStack_438 < 0x7fffffff) {
                                      pIStack_398 = (ImFontConfig *)(ulong)(uint)fVar139;
                                      uStack_390 = 0;
                                      uStack_38c = 0;
                                      uStack_468._4_4_ = (undefined4)((ulong)uStack_468 >> 0x20);
                                      uStack_468 = CONCAT44(uStack_468._4_4_,fVar140);
                                      auStack_488 = ZEXT416((uint)fVar147);
                                      fVar141 = 0.0;
                                      do {
                                        fVar147 = (float)(int)fVar141;
                                        fVar148 = (float)((int)fVar141 + 1);
                                        fVar150 = (float)(int)fVar148;
                                        fVar142 = (fVar147 - fVar139) / fVar140 + fVar97;
                                        fVar140 = (fVar150 - fVar139) / fVar140 + fVar97;
                                        fVar151 = auStack_488._0_4_;
                                        if ((fVar147 <= fVar139) || (fVar151 <= fVar150)) {
                                          if ((fVar147 <= fVar151) || (fVar139 <= fVar150)) {
                                            fVar160 = fVar97;
                                            if (((fVar147 <= fVar139) || (fVar151 <= fVar147)) &&
                                               ((fVar147 <= fVar151 || (fVar139 <= fVar147)))) {
                                              fVar142 = fVar97;
                                              if (((fVar139 < fVar150) && (fVar150 < fVar151)) ||
                                                 ((fVar147 = fVar139, fVar151 < fVar150 &&
                                                  (fVar150 < fVar139)))) goto LAB_001f189c;
                                              goto LAB_001f194a;
                                            }
                                          }
                                          else {
                                            stbtt__handle_clipped_edge
                                                      ((float *)scanline,(int)fVar141,psVar68,
                                                       fVar139,fVar97,fVar150,fVar140);
                                            fVar139 = fVar150;
                                            fVar160 = fVar140;
                                          }
                                          stbtt__handle_clipped_edge
                                                    ((float *)scanline,(int)fVar141,psVar68,fVar139,
                                                     fVar160,fVar147,fVar142);
                                        }
                                        else {
                                          stbtt__handle_clipped_edge
                                                    ((float *)scanline,(int)fVar141,psVar68,fVar139,
                                                     fVar97,fVar147,fVar142);
                                          fVar139 = fVar147;
LAB_001f189c:
                                          stbtt__handle_clipped_edge
                                                    ((float *)scanline,(int)fVar141,psVar68,fVar139,
                                                     fVar142,fVar150,fVar140);
                                          fVar147 = fVar150;
                                          fVar142 = fVar140;
                                        }
LAB_001f194a:
                                        stbtt__handle_clipped_edge
                                                  ((float *)scanline,(int)fVar141,psVar68,fVar147,
                                                   fVar142,auStack_488._0_4_,fVar117);
                                        fVar139 = pIStack_398._0_4_;
                                        fVar140 = (float)uStack_468;
                                        fVar141 = fVar148;
                                      } while (fStack_48c != fVar148);
                                    }
                                  }
                                  else if (fVar139 < fStack_41c) {
                                    if (0.0 <= fVar139) {
                                      pIStack_398 = (ImFontConfig *)(ulong)(uint)fVar139;
                                      uStack_390 = 0;
                                      uStack_38c = 0;
                                      stbtt__handle_clipped_edge
                                                ((float *)scanline,(int)fVar139,psVar68,fVar139,
                                                 fVar97,fVar139,fVar117);
                                      iVar81 = (int)fVar139 + 1;
                                      fVar139 = pIStack_398._0_4_;
                                    }
                                    else {
                                      iVar81 = 0;
                                    }
                                    stbtt__handle_clipped_edge
                                              (pfStack_368,iVar81,psVar68,fVar139,fVar97,fVar139,
                                               fVar117);
                                  }
LAB_001f1ba5:
                                  psVar70 = (stbtt__active_edge *)auStack_4a8._0_8_;
                                  puVar83 = puStack_3b8;
                                }
                                uVar60 = (uint)DAT_00299c80;
                                auVar130._0_12_ = ZEXT812(0x437f0000);
                                auVar130._12_4_ = 0.0;
                                psVar68 = psVar70;
                                if ((uint)uStack_438 < 0x7fffffff) {
                                  fVar117 = 0.0;
                                  psVar69 = scanline;
                                  uVar82 = uStack_380;
                                  lVar99 = lStack_2f0;
                                  do {
                                    fVar117 = fVar117 + *(float *)((long)&psVar69->data +
                                                                  lStack_2f0 * 4);
                                    iVar81 = (int)((float)((uint)(*(float *)&psVar69->data + fVar117
                                                                 ) & uVar60) * 255.0 + 0.5);
                                    uVar85 = (uchar)iVar81;
                                    if (0xfe < iVar81) {
                                      uVar85 = 0xff;
                                    }
                                    puStack_370[(int)uVar82] = uVar85;
                                    uVar82 = (ulong)((int)uVar82 + 1);
                                    psVar69 = (stbtt__buf *)((long)&psVar69->data + 4);
                                    lVar99 = lVar99 + -1;
                                  } while (lVar99 != 0);
                                }
                                for (; psVar68 != (stbtt__active_edge *)0x0; psVar68 = psVar68->next
                                    ) {
                                  psVar68->fx = psVar68->fdx + psVar68->fx;
                                }
                                iVar93 = (int)uStack_378;
                                uStack_378 = (ulong)(iVar93 + 1);
                                uStack_380 = (ulong)(uint)((int)uStack_380 + iStack_45c);
                                iVar81 = iStack_35c + 1;
                              } while (iVar93 != (uint)uStack_3f8);
                              while (puVar83 != (undefined8 *)0x0) {
                                puVar10 = (undefined8 *)*puVar83;
                                ImGui::MemFree(puVar83);
                                puVar83 = puVar10;
                              }
                            }
                            pvVar67 = (void *)auStack_458._0_8_;
                            if (scanline != asStack_238) {
                              ImGui::MemFree(scanline);
                            }
                            ImGui::MemFree(psStack_470);
                          }
                          ImGui::MemFree(pvStack_440);
                          ImGui::MemFree(pvVar67);
                        }
                      }
                    }
                  }
                }
LAB_001f1e86:
                ImGui::MemFree((void *)CONCAT44(uStack_430._4_4_,(stbtt_uint32)uStack_430));
                uVar82 = (ulong)*(ushort *)(lStack_3b0 + 8);
                uVar50 = *(ushort *)(lStack_3b0 + 10);
                uVar113 = *(ushort *)(lStack_3b0 + 4);
                uVar60 = (uint)uVar113;
                uVar51 = *(ushort *)(lStack_3b0 + 6);
                iVar81 = (int)uStack_498;
                auVar132 = _DAT_002a98e0;
                auVar118 = _DAT_002a98c0;
                if (1 < (byte)uStack_328) {
                  asStack_238[0].data = (uchar *)0x0;
                  uVar96 = 0;
                  if (uVar51 == 0) {
                    uVar51 = 0;
                  }
                  else {
                    puVar66 = puStack_388 +
                              (long)(int)((uint)uVar50 * iStack_45c) +
                              (ulong)*(ushort *)(lStack_3b0 + 8);
                    iVar81 = (uint)uVar113 - (int)uStack_3e8;
                    uVar60 = iVar81 + 1;
                    uVar82 = (ulong)uVar60;
                    do {
                      uVar78 = uStack_328;
                      memset(asStack_238,0,uStack_328);
                      auVar132 = _DAT_002a98e0;
                      auVar118 = _DAT_002a98c0;
                      uVar98 = uVar60;
                      switch((int)uVar78) {
                      case 2:
                        if (iVar81 < 0) {
LAB_001f2113:
                          uVar78 = 0;
                          uVar98 = 0;
                        }
                        else {
                          uVar88 = 0;
                          uVar78 = 0;
                          do {
                            bVar103 = puVar66[uVar88];
                            bVar4 = *(byte *)((long)&asStack_238[0].data + (ulong)((uint)uVar88 & 7)
                                             );
                            *(byte *)((long)&asStack_238[0].data + (ulong)((uint)uVar88 + 2 & 7)) =
                                 bVar103;
                            uVar73 = (int)uVar78 + ((uint)bVar103 - (uint)bVar4);
                            uVar78 = (ulong)uVar73;
                            puVar66[uVar88] = (uchar)(uVar73 >> 1);
                            uVar88 = uVar88 + 1;
                          } while (uVar82 != uVar88);
                        }
                        break;
                      case 3:
                        if (iVar81 < 0) goto LAB_001f2113;
                        uVar88 = 0;
                        uVar78 = 0;
                        do {
                          bVar103 = puVar66[uVar88];
                          bVar4 = *(byte *)((long)&asStack_238[0].data + (ulong)((uint)uVar88 & 7));
                          *(byte *)((long)&asStack_238[0].data + (ulong)((uint)uVar88 + 3 & 7)) =
                               bVar103;
                          uVar78 = (ulong)((int)uVar78 + ((uint)bVar103 - (uint)bVar4));
                          puVar66[uVar88] = (uchar)(uVar78 / 3);
                          uVar88 = uVar88 + 1;
                        } while (uVar82 != uVar88);
                        break;
                      case 4:
                        if (iVar81 < 0) goto LAB_001f2113;
                        uVar88 = 0;
                        uVar78 = 0;
                        do {
                          bVar103 = puVar66[uVar88];
                          uVar87 = (ulong)((uint)uVar88 & 7);
                          bVar4 = *(byte *)((long)&asStack_238[0].data + uVar87);
                          *(byte *)((long)&asStack_238[0].data + (uVar87 ^ 4)) = bVar103;
                          uVar73 = (int)uVar78 + ((uint)bVar103 - (uint)bVar4);
                          uVar78 = (ulong)uVar73;
                          puVar66[uVar88] = (uchar)(uVar73 >> 2);
                          uVar88 = uVar88 + 1;
                        } while (uVar82 != uVar88);
                        break;
                      case 5:
                        if (iVar81 < 0) goto LAB_001f2113;
                        uVar88 = 0;
                        uVar78 = 0;
                        do {
                          bVar103 = puVar66[uVar88];
                          bVar4 = *(byte *)((long)&asStack_238[0].data + (ulong)((uint)uVar88 & 7));
                          *(byte *)((long)&asStack_238[0].data + (ulong)((uint)uVar88 + 5 & 7)) =
                               bVar103;
                          uVar78 = (ulong)((int)uVar78 + ((uint)bVar103 - (uint)bVar4));
                          puVar66[uVar88] = (uchar)(uVar78 / 5);
                          uVar88 = uVar88 + 1;
                        } while (uVar82 != uVar88);
                        break;
                      default:
                        if (iVar81 < 0) {
                          uVar78 = 0;
                          uVar98 = 0;
                        }
                        else {
                          uVar88 = 0;
                          uVar78 = 0;
                          do {
                            bVar103 = puVar66[uVar88];
                            bVar4 = *(byte *)((long)&asStack_238[0].data + (ulong)((uint)uVar88 & 7)
                                             );
                            *(byte *)((long)&asStack_238[0].data +
                                     (ulong)((int)uStack_3e8 + (uint)uVar88 & 7)) = bVar103;
                            uVar78 = (ulong)((int)uVar78 + ((uint)bVar103 - (uint)bVar4));
                            puVar66[uVar88] = (uchar)(uVar78 / (uStack_3e8 & 0xffffffff));
                            uVar88 = uVar88 + 1;
                          } while (uVar82 != uVar88);
                        }
                      }
                      if ((int)uVar98 < (int)(uint)uVar113) {
                        uVar88 = (ulong)uVar98;
                        do {
                          uVar78 = (ulong)((int)uVar78 -
                                          (uint)*(byte *)((long)&asStack_238[0].data +
                                                         (ulong)((uint)uVar88 & 7)));
                          puVar66[uVar88] = (uchar)(uVar78 / (uStack_3e8 & 0xffffffff));
                          uVar88 = uVar88 + 1;
                        } while ((int)uVar88 < (int)(uint)uVar113);
                      }
                      puVar66 = puVar66 + lVar84;
                      uVar96 = uVar96 + 1;
                    } while (uVar96 != uVar51);
                    uVar82 = (ulong)*(ushort *)(lStack_3b0 + 8);
                    uVar50 = *(ushort *)(lStack_3b0 + 10);
                    uVar60 = (uint)*(ushort *)(lStack_3b0 + 4);
                    uVar51 = *(ushort *)(lStack_3b0 + 6);
                    iVar81 = (int)uStack_498;
                  }
                }
                sVar72 = (short)uVar82;
                if (1 < (byte)uStack_320) {
                  asStack_238[0].data = (uchar *)0x0;
                  uVar96 = 0;
                  if ((short)uVar60 == 0) {
                    uVar60 = 0;
                  }
                  else {
                    pbVar102 = puStack_388 + (long)(int)((uint)uVar50 * iStack_45c) + uVar82;
                    iVar81 = (uint)uVar51 - iVar81;
                    uVar98 = iVar81 + 1;
                    uVar82 = (ulong)uVar98;
                    do {
                      uVar78 = uStack_320;
                      memset(asStack_238,0,uStack_320);
                      auVar132 = _DAT_002a98e0;
                      auVar118 = _DAT_002a98c0;
                      uVar73 = uVar98;
                      switch((int)uVar78) {
                      case 2:
                        if (iVar81 < 0) {
LAB_001f24bf:
                          uVar78 = 0;
                          uVar73 = 0;
                        }
                        else {
                          uVar88 = 0;
                          uVar78 = 0;
                          pbVar91 = pbVar102;
                          do {
                            bVar103 = *pbVar91;
                            bVar4 = *(byte *)((long)&asStack_238[0].data + (ulong)((uint)uVar88 & 7)
                                             );
                            *(byte *)((long)&asStack_238[0].data + (ulong)((uint)uVar88 + 2 & 7)) =
                                 bVar103;
                            uVar74 = (int)uVar78 + ((uint)bVar103 - (uint)bVar4);
                            uVar78 = (ulong)uVar74;
                            *pbVar91 = (byte)(uVar74 >> 1);
                            uVar88 = uVar88 + 1;
                            pbVar91 = pbVar91 + lVar84;
                          } while (uVar82 != uVar88);
                        }
                        break;
                      case 3:
                        if (iVar81 < 0) goto LAB_001f24bf;
                        uVar88 = 0;
                        uVar78 = 0;
                        pbVar91 = pbVar102;
                        do {
                          bVar103 = *pbVar91;
                          bVar4 = *(byte *)((long)&asStack_238[0].data + (ulong)((uint)uVar88 & 7));
                          *(byte *)((long)&asStack_238[0].data + (ulong)((uint)uVar88 + 3 & 7)) =
                               bVar103;
                          uVar78 = (ulong)((int)uVar78 + ((uint)bVar103 - (uint)bVar4));
                          *pbVar91 = (byte)(uVar78 / 3);
                          uVar88 = uVar88 + 1;
                          pbVar91 = pbVar91 + lVar84;
                        } while (uVar82 != uVar88);
                        break;
                      case 4:
                        if (iVar81 < 0) goto LAB_001f24bf;
                        uVar88 = 0;
                        uVar78 = 0;
                        pbVar91 = pbVar102;
                        do {
                          bVar103 = *pbVar91;
                          uVar87 = (ulong)((uint)uVar88 & 7);
                          bVar4 = *(byte *)((long)&asStack_238[0].data + uVar87);
                          *(byte *)((long)&asStack_238[0].data + (uVar87 ^ 4)) = bVar103;
                          uVar74 = (int)uVar78 + ((uint)bVar103 - (uint)bVar4);
                          uVar78 = (ulong)uVar74;
                          *pbVar91 = (byte)(uVar74 >> 2);
                          uVar88 = uVar88 + 1;
                          pbVar91 = pbVar91 + lVar84;
                        } while (uVar82 != uVar88);
                        break;
                      case 5:
                        if (iVar81 < 0) goto LAB_001f24bf;
                        uVar88 = 0;
                        uVar78 = 0;
                        pbVar91 = pbVar102;
                        do {
                          bVar103 = *pbVar91;
                          bVar4 = *(byte *)((long)&asStack_238[0].data + (ulong)((uint)uVar88 & 7));
                          *(byte *)((long)&asStack_238[0].data + (ulong)((uint)uVar88 + 5 & 7)) =
                               bVar103;
                          uVar78 = (ulong)((int)uVar78 + ((uint)bVar103 - (uint)bVar4));
                          *pbVar91 = (byte)(uVar78 / 5);
                          uVar88 = uVar88 + 1;
                          pbVar91 = pbVar91 + lVar84;
                        } while (uVar82 != uVar88);
                        break;
                      default:
                        if (iVar81 < 0) {
                          uVar78 = 0;
                          uVar73 = 0;
                        }
                        else {
                          uVar88 = 0;
                          uVar78 = 0;
                          pbVar91 = pbVar102;
                          do {
                            bVar103 = *pbVar91;
                            bVar4 = *(byte *)((long)&asStack_238[0].data + (ulong)((uint)uVar88 & 7)
                                             );
                            *(byte *)((long)&asStack_238[0].data +
                                     (ulong)((int)uStack_498 + (uint)uVar88 & 7)) = bVar103;
                            uVar78 = (ulong)((int)uVar78 + ((uint)bVar103 - (uint)bVar4));
                            *pbVar91 = (byte)(uVar78 / (uStack_498 & 0xffffffff));
                            uVar88 = uVar88 + 1;
                            pbVar91 = pbVar91 + lVar84;
                          } while (uVar82 != uVar88);
                        }
                      }
                      if ((int)uVar73 < (int)(uint)uVar51) {
                        uVar88 = (ulong)(int)uVar73;
                        pbVar91 = pbVar102 + lVar84 * uVar88;
                        do {
                          uVar78 = (ulong)((int)uVar78 -
                                          (uint)*(byte *)((long)&asStack_238[0].data +
                                                         (ulong)((uint)uVar88 & 7)));
                          *pbVar91 = (byte)(uVar78 / (uStack_498 & 0xffffffff));
                          uVar88 = uVar88 + 1;
                          pbVar91 = pbVar91 + lVar84;
                        } while (uVar51 != uVar88);
                      }
                      pbVar102 = pbVar102 + 1;
                      uVar96 = uVar96 + 1;
                    } while (uVar96 != uVar60);
                    sVar72 = *(short *)(lStack_3b0 + 8);
                    uVar50 = *(ushort *)(lStack_3b0 + 10);
                    uVar60 = (uint)*(ushort *)(lStack_3b0 + 4);
                    uVar51 = *(ushort *)(lStack_3b0 + 6);
                  }
                }
                *psStack_2d0 = sVar72;
                psStack_2d0[1] = uVar50;
                psStack_2d0[2] = sVar72 + (short)uVar60;
                psStack_2d0[3] = uVar51 + uVar50;
                *(float *)(psStack_2d0 + 8) =
                     (float)(int)(short)((short)(uStack_354 << 8) + (short)uStack_358) *
                     (float)auStack_318._0_4_;
                *(ulong *)(psStack_2d0 + 4) =
                     CONCAT44((float)iStack_34c * auStack_268._4_4_ + (float)auStack_258._4_4_,
                              (float)iStack_348 * auStack_268._0_4_ + (float)auStack_258._0_4_);
                *(float *)(psStack_2d0 + 10) =
                     (float)(int)(uVar60 + iStack_348) * auStack_268._0_4_ +
                     (float)auStack_258._0_4_;
                *(float *)(psStack_2d0 + 0xc) =
                     (float)(int)((uint)uVar51 + iStack_34c) * (float)auStack_278._0_4_ +
                     (float)auStack_288._0_4_;
                iVar81 = psStack_3c0[1].fontstart;
                lVar99 = lStack_2d8;
                lVar79 = lStack_2c8;
                psVar101 = psStack_3c0;
                auVar134 = _DAT_0022f730;
                auVar126 = auStack_268;
              }
            }
            lVar79 = lVar79 + 1;
          } while (lVar79 < iVar81);
        }
        fVar117 = pIStack_2f8[lStack_338].RasterizerMultiply;
        if ((fVar117 != 1.0) || (NAN(fVar117))) {
          lVar99 = 0;
          auVar120 = _DAT_002a9880;
          auVar127 = _DAT_002a9870;
          auVar131 = _DAT_002a9860;
          auVar133 = _DAT_002a9850;
          do {
            fVar97 = auVar118._0_4_;
            fVar139 = auVar118._4_4_;
            fVar140 = auVar118._8_4_;
            fVar141 = auVar118._12_4_;
            auVar118 = auVar127 & _DAT_002a9890 | _DAT_002a98a0;
            uVar60 = auVar127._4_4_;
            uVar96 = auVar127._8_4_;
            uVar98 = auVar127._12_4_;
            auVar134 = auVar120 & _DAT_002a9890 | _DAT_002a98a0;
            uVar73 = auVar120._4_4_;
            uVar74 = auVar120._8_4_;
            uVar149 = auVar120._12_4_;
            auVar166 = auVar133 & _DAT_002a9890 | _DAT_002a98a0;
            uVar159 = auVar133._4_4_;
            uVar161 = auVar133._8_4_;
            uVar163 = auVar133._12_4_;
            auVar104 = auVar131 & _DAT_002a9890 | _DAT_002a98a0;
            uVar170 = auVar131._4_4_;
            uVar172 = auVar131._8_4_;
            uVar174 = auVar131._12_4_;
            fVar165 = (((float)(auVar131._0_4_ >> 0x10 | 0x53000000) - fVar97) + auVar104._0_4_) *
                      fVar117;
            fVar171 = (((float)(uVar170 >> 0x10 | 0x53000000) - fVar139) + auVar104._4_4_) * fVar117
            ;
            fVar173 = (((float)(uVar172 >> 0x10 | 0x53000000) - fVar140) + auVar104._8_4_) * fVar117
            ;
            fVar175 = (((float)(uVar174 >> 0x10 | 0x53000000) - fVar141) + auVar104._12_4_) *
                      fVar117;
            fVar151 = (((float)(auVar133._0_4_ >> 0x10 | 0x53000000) - fVar97) + auVar166._0_4_) *
                      fVar117;
            fVar160 = (((float)(uVar159 >> 0x10 | 0x53000000) - fVar139) + auVar166._4_4_) * fVar117
            ;
            fVar162 = (((float)(uVar161 >> 0x10 | 0x53000000) - fVar140) + auVar166._8_4_) * fVar117
            ;
            fVar164 = (((float)(uVar163 >> 0x10 | 0x53000000) - fVar141) + auVar166._12_4_) *
                      fVar117;
            fVar142 = (((float)(auVar120._0_4_ >> 0x10 | 0x53000000) - fVar97) + auVar134._0_4_) *
                      fVar117;
            fVar147 = (((float)(uVar73 >> 0x10 | 0x53000000) - fVar139) + auVar134._4_4_) * fVar117;
            fVar148 = (((float)(uVar74 >> 0x10 | 0x53000000) - fVar140) + auVar134._8_4_) * fVar117;
            fVar150 = (((float)(uVar149 >> 0x10 | 0x53000000) - fVar141) + auVar134._12_4_) *
                      fVar117;
            fVar97 = (((float)(auVar127._0_4_ >> 0x10 | 0x53000000) - fVar97) + auVar118._0_4_) *
                     fVar117;
            fVar139 = (((float)(uVar60 >> 0x10 | 0x53000000) - fVar139) + auVar118._4_4_) * fVar117;
            fVar140 = (((float)(uVar96 >> 0x10 | 0x53000000) - fVar140) + auVar118._8_4_) * fVar117;
            fVar141 = (((float)(uVar98 >> 0x10 | 0x53000000) - fVar141) + auVar118._12_4_) * fVar117
            ;
            auVar138._0_4_ = (int)fVar97;
            auVar138._4_4_ = (int)fVar139;
            auVar138._8_4_ = (int)fVar140;
            auVar138._12_4_ = (int)fVar141;
            auVar186._0_4_ = auVar138._0_4_ >> 0x1f;
            auVar186._4_4_ = auVar138._4_4_ >> 0x1f;
            auVar186._8_4_ = auVar138._8_4_ >> 0x1f;
            auVar186._12_4_ = auVar138._12_4_ >> 0x1f;
            auVar137._0_4_ = (int)(fVar97 - 2.1474836e+09);
            auVar137._4_4_ = (int)(fVar139 - 2.1474836e+09);
            auVar137._8_4_ = (int)(fVar140 - 2.1474836e+09);
            auVar137._12_4_ = (int)(fVar141 - 2.1474836e+09);
            auVar138 = auVar137 & auVar186 | auVar138;
            auVar146._0_4_ = (int)fVar142;
            auVar146._4_4_ = (int)fVar147;
            auVar146._8_4_ = (int)fVar148;
            auVar146._12_4_ = (int)fVar150;
            auVar187._0_4_ = auVar146._0_4_ >> 0x1f;
            auVar187._4_4_ = auVar146._4_4_ >> 0x1f;
            auVar187._8_4_ = auVar146._8_4_ >> 0x1f;
            auVar187._12_4_ = auVar146._12_4_ >> 0x1f;
            auVar145._0_4_ = (int)(fVar142 - 2.1474836e+09);
            auVar145._4_4_ = (int)(fVar147 - 2.1474836e+09);
            auVar145._8_4_ = (int)(fVar148 - 2.1474836e+09);
            auVar145._12_4_ = (int)(fVar150 - 2.1474836e+09);
            auVar146 = auVar145 & auVar187 | auVar146;
            auVar182._0_4_ = (int)fVar151;
            auVar182._4_4_ = (int)fVar160;
            auVar182._8_4_ = (int)fVar162;
            auVar182._12_4_ = (int)fVar164;
            auVar190._0_4_ = auVar182._0_4_ >> 0x1f;
            auVar190._4_4_ = auVar182._4_4_ >> 0x1f;
            auVar190._8_4_ = auVar182._8_4_ >> 0x1f;
            auVar190._12_4_ = auVar182._12_4_ >> 0x1f;
            auVar181._0_4_ = (int)(fVar151 - 2.1474836e+09);
            auVar181._4_4_ = (int)(fVar160 - 2.1474836e+09);
            auVar181._8_4_ = (int)(fVar162 - 2.1474836e+09);
            auVar181._12_4_ = (int)(fVar164 - 2.1474836e+09);
            auVar182 = auVar181 & auVar190 | auVar182;
            auVar168._0_4_ = (int)fVar165;
            auVar168._4_4_ = (int)fVar171;
            auVar168._8_4_ = (int)fVar173;
            auVar168._12_4_ = (int)fVar175;
            auVar188._0_4_ = auVar168._0_4_ >> 0x1f;
            auVar188._4_4_ = auVar168._4_4_ >> 0x1f;
            auVar188._8_4_ = auVar168._8_4_ >> 0x1f;
            auVar188._12_4_ = auVar168._12_4_ >> 0x1f;
            auVar167._0_4_ = (int)(fVar165 - 2.1474836e+09);
            auVar167._4_4_ = (int)(fVar171 - 2.1474836e+09);
            auVar167._8_4_ = (int)(fVar173 - 2.1474836e+09);
            auVar167._12_4_ = (int)(fVar175 - 2.1474836e+09);
            auVar168 = auVar167 & auVar188 | auVar168;
            auVar118 = auVar168 ^ _DAT_0022f730;
            auVar157._0_4_ = -(uint)(auVar118._0_4_ < -0x7fffff01);
            auVar157._4_4_ = -(uint)(auVar118._4_4_ < -0x7fffff01);
            auVar157._8_4_ = -(uint)(auVar118._8_4_ < -0x7fffff01);
            auVar157._12_4_ = -(uint)(auVar118._12_4_ < -0x7fffff01);
            auVar118 = ~auVar157 & auVar132 | auVar168 & auVar157;
            auVar134 = auVar182 ^ _DAT_0022f730;
            auVar189._0_4_ = -(uint)(auVar134._0_4_ < -0x7fffff01);
            auVar189._4_4_ = -(uint)(auVar134._4_4_ < -0x7fffff01);
            auVar189._8_4_ = -(uint)(auVar134._8_4_ < -0x7fffff01);
            auVar189._12_4_ = -(uint)(auVar134._12_4_ < -0x7fffff01);
            auVar134 = ~auVar189 & auVar132 | auVar182 & auVar189;
            sVar72 = auVar118._0_2_;
            cVar11 = (0 < sVar72) * (sVar72 < 0x100) * auVar118[0] - (0xff < sVar72);
            sVar72 = auVar118._2_2_;
            sVar52 = CONCAT11((0 < sVar72) * (sVar72 < 0x100) * auVar118[2] - (0xff < sVar72),cVar11
                             );
            sVar72 = auVar118._4_2_;
            cVar111 = (0 < sVar72) * (sVar72 < 0x100) * auVar118[4] - (0xff < sVar72);
            sVar72 = auVar118._6_2_;
            uVar152 = CONCAT13((0 < sVar72) * (sVar72 < 0x100) * auVar118[6] - (0xff < sVar72),
                               CONCAT12(cVar111,sVar52));
            sVar72 = auVar118._8_2_;
            cVar12 = (0 < sVar72) * (sVar72 < 0x100) * auVar118[8] - (0xff < sVar72);
            sVar72 = auVar118._10_2_;
            uVar153 = CONCAT15((0 < sVar72) * (sVar72 < 0x100) * auVar118[10] - (0xff < sVar72),
                               CONCAT14(cVar12,uVar152));
            sVar72 = auVar118._12_2_;
            cVar13 = (0 < sVar72) * (sVar72 < 0x100) * auVar118[0xc] - (0xff < sVar72);
            sVar72 = auVar118._14_2_;
            uVar154 = CONCAT17((0 < sVar72) * (sVar72 < 0x100) * auVar118[0xe] - (0xff < sVar72),
                               CONCAT16(cVar13,uVar153));
            sVar72 = auVar134._0_2_;
            cVar14 = (0 < sVar72) * (sVar72 < 0x100) * auVar134[0] - (0xff < sVar72);
            sVar72 = auVar134._2_2_;
            auVar155._0_10_ =
                 CONCAT19((0 < sVar72) * (sVar72 < 0x100) * auVar134[2] - (0xff < sVar72),
                          CONCAT18(cVar14,uVar154));
            sVar72 = auVar134._4_2_;
            cVar15 = (0 < sVar72) * (sVar72 < 0x100) * auVar134[4] - (0xff < sVar72);
            auVar155[10] = cVar15;
            sVar72 = auVar134._6_2_;
            auVar155[0xb] = (0 < sVar72) * (sVar72 < 0x100) * auVar134[6] - (0xff < sVar72);
            sVar72 = auVar134._8_2_;
            cVar114 = (0 < sVar72) * (sVar72 < 0x100) * auVar134[8] - (0xff < sVar72);
            auVar156[0xc] = cVar114;
            auVar156._0_12_ = auVar155;
            sVar72 = auVar134._10_2_;
            auVar156[0xd] = (0 < sVar72) * (sVar72 < 0x100) * auVar134[10] - (0xff < sVar72);
            sVar72 = auVar134._12_2_;
            cVar112 = (0 < sVar72) * (sVar72 < 0x100) * auVar134[0xc] - (0xff < sVar72);
            auVar158[0xe] = cVar112;
            auVar158._0_14_ = auVar156;
            sVar72 = auVar134._14_2_;
            auVar158[0xf] = (0 < sVar72) * (sVar72 < 0x100) * auVar134[0xe] - (0xff < sVar72);
            auVar118 = auVar146 ^ _DAT_0022f730;
            auVar183._0_4_ = -(uint)(auVar118._0_4_ < -0x7fffff01);
            auVar183._4_4_ = -(uint)(auVar118._4_4_ < -0x7fffff01);
            auVar183._8_4_ = -(uint)(auVar118._8_4_ < -0x7fffff01);
            auVar183._12_4_ = -(uint)(auVar118._12_4_ < -0x7fffff01);
            auVar134 = ~auVar183 & auVar132 | auVar146 & auVar183;
            auVar118 = auVar138 ^ _DAT_0022f730;
            auVar169._0_4_ = -(uint)(auVar118._0_4_ < -0x7fffff01);
            auVar169._4_4_ = -(uint)(auVar118._4_4_ < -0x7fffff01);
            auVar169._8_4_ = -(uint)(auVar118._8_4_ < -0x7fffff01);
            auVar169._12_4_ = -(uint)(auVar118._12_4_ < -0x7fffff01);
            auVar118 = ~auVar169 & auVar132 | auVar138 & auVar169;
            sVar72 = auVar134._0_2_;
            cVar16 = (0 < sVar72) * (sVar72 < 0x100) * auVar134[0] - (0xff < sVar72);
            sVar72 = auVar134._2_2_;
            sVar115 = CONCAT11((0 < sVar72) * (sVar72 < 0x100) * auVar134[2] - (0xff < sVar72),
                               cVar16);
            sVar72 = auVar134._4_2_;
            cVar17 = (0 < sVar72) * (sVar72 < 0x100) * auVar134[4] - (0xff < sVar72);
            sVar72 = auVar134._6_2_;
            uVar176 = CONCAT13((0 < sVar72) * (sVar72 < 0x100) * auVar134[6] - (0xff < sVar72),
                               CONCAT12(cVar17,sVar115));
            sVar72 = auVar134._8_2_;
            cVar18 = (0 < sVar72) * (sVar72 < 0x100) * auVar134[8] - (0xff < sVar72);
            sVar72 = auVar134._10_2_;
            uVar177 = CONCAT15((0 < sVar72) * (sVar72 < 0x100) * auVar134[10] - (0xff < sVar72),
                               CONCAT14(cVar18,uVar176));
            sVar72 = auVar134._12_2_;
            cVar19 = (0 < sVar72) * (sVar72 < 0x100) * auVar134[0xc] - (0xff < sVar72);
            sVar72 = auVar134._14_2_;
            uVar178 = CONCAT17((0 < sVar72) * (sVar72 < 0x100) * auVar134[0xe] - (0xff < sVar72),
                               CONCAT16(cVar19,uVar177));
            sVar72 = auVar118._0_2_;
            cVar20 = (0 < sVar72) * (sVar72 < 0x100) * auVar118[0] - (0xff < sVar72);
            sVar72 = auVar118._2_2_;
            auVar179._0_10_ =
                 CONCAT19((0 < sVar72) * (sVar72 < 0x100) * auVar118[2] - (0xff < sVar72),
                          CONCAT18(cVar20,uVar178));
            sVar72 = auVar118._4_2_;
            cVar21 = (0 < sVar72) * (sVar72 < 0x100) * auVar118[4] - (0xff < sVar72);
            auVar179[10] = cVar21;
            sVar72 = auVar118._6_2_;
            auVar179[0xb] = (0 < sVar72) * (sVar72 < 0x100) * auVar118[6] - (0xff < sVar72);
            sVar72 = auVar118._8_2_;
            cVar22 = (0 < sVar72) * (sVar72 < 0x100) * auVar118[8] - (0xff < sVar72);
            auVar180[0xc] = cVar22;
            auVar180._0_12_ = auVar179;
            sVar72 = auVar118._10_2_;
            auVar180[0xd] = (0 < sVar72) * (sVar72 < 0x100) * auVar118[10] - (0xff < sVar72);
            sVar72 = auVar118._12_2_;
            cVar23 = (0 < sVar72) * (sVar72 < 0x100) * auVar118[0xc] - (0xff < sVar72);
            auVar184[0xe] = cVar23;
            auVar184._0_14_ = auVar180;
            sVar72 = auVar118._14_2_;
            auVar184[0xf] = (0 < sVar72) * (sVar72 < 0x100) * auVar118[0xe] - (0xff < sVar72);
            sVar72 = (short)((uint)uVar176 >> 0x10);
            auVar185[1] = (0 < sVar72) * (sVar72 < 0x100) * cVar17 - (0xff < sVar72);
            auVar185[0] = (0 < sVar115) * (sVar115 < 0x100) * cVar16 - (0xff < sVar115);
            sVar72 = (short)((uint6)uVar177 >> 0x20);
            auVar185[2] = (0 < sVar72) * (sVar72 < 0x100) * cVar18 - (0xff < sVar72);
            sVar72 = (short)((ulong)uVar178 >> 0x30);
            auVar185[3] = (0 < sVar72) * (sVar72 < 0x100) * cVar19 - (0xff < sVar72);
            sVar72 = (short)((unkuint10)auVar179._0_10_ >> 0x40);
            auVar185[4] = (0 < sVar72) * (sVar72 < 0x100) * cVar20 - (0xff < sVar72);
            sVar72 = auVar179._10_2_;
            auVar185[5] = (0 < sVar72) * (sVar72 < 0x100) * cVar21 - (0xff < sVar72);
            sVar72 = auVar180._12_2_;
            auVar185[6] = (0 < sVar72) * (sVar72 < 0x100) * cVar22 - (0xff < sVar72);
            sVar72 = auVar184._14_2_;
            auVar185[7] = (0 < sVar72) * (sVar72 < 0x100) * cVar23 - (0xff < sVar72);
            auVar185[8] = (0 < sVar52) * (sVar52 < 0x100) * cVar11 - (0xff < sVar52);
            sVar72 = (short)((uint)uVar152 >> 0x10);
            auVar185[9] = (0 < sVar72) * (sVar72 < 0x100) * cVar111 - (0xff < sVar72);
            sVar72 = (short)((uint6)uVar153 >> 0x20);
            auVar185[10] = (0 < sVar72) * (sVar72 < 0x100) * cVar12 - (0xff < sVar72);
            sVar72 = (short)((ulong)uVar154 >> 0x30);
            auVar185[0xb] = (0 < sVar72) * (sVar72 < 0x100) * cVar13 - (0xff < sVar72);
            sVar72 = (short)((unkuint10)auVar155._0_10_ >> 0x40);
            auVar185[0xc] = (0 < sVar72) * (sVar72 < 0x100) * cVar14 - (0xff < sVar72);
            sVar72 = auVar155._10_2_;
            auVar185[0xd] = (0 < sVar72) * (sVar72 < 0x100) * cVar15 - (0xff < sVar72);
            sVar72 = auVar156._12_2_;
            auVar185[0xe] = (0 < sVar72) * (sVar72 < 0x100) * cVar114 - (0xff < sVar72);
            sVar72 = auVar158._14_2_;
            auVar185[0xf] = (0 < sVar72) * (sVar72 < 0x100) * cVar112 - (0xff < sVar72);
            *(undefined1 (*) [16])((long)&asStack_238[0].data + lVar99) = auVar185;
            lVar99 = lVar99 + 0x10;
            iVar81 = (int)DAT_002a98f0;
            auVar120._0_4_ = auVar120._0_4_ + iVar81;
            iVar93 = DAT_002a98f0._4_4_;
            auVar120._4_4_ = uVar73 + iVar93;
            iVar61 = DAT_002a98f0._8_4_;
            auVar120._8_4_ = uVar74 + iVar61;
            iVar62 = DAT_002a98f0._12_4_;
            auVar120._12_4_ = uVar149 + iVar62;
            auVar127._0_4_ = auVar127._0_4_ + iVar81;
            auVar127._4_4_ = uVar60 + iVar93;
            auVar127._8_4_ = uVar96 + iVar61;
            auVar127._12_4_ = uVar98 + iVar62;
            auVar131._0_4_ = auVar131._0_4_ + iVar81;
            auVar131._4_4_ = uVar170 + iVar93;
            auVar131._8_4_ = uVar172 + iVar61;
            auVar131._12_4_ = uVar174 + iVar62;
            auVar133._0_4_ = auVar133._0_4_ + iVar81;
            auVar133._4_4_ = uVar159 + iVar93;
            auVar133._8_4_ = uVar161 + iVar61;
            auVar133._12_4_ = uVar163 + iVar62;
            auVar118 = _DAT_002a98c0;
          } while (lVar99 != 0x100);
          iVar81 = psVar101[1].cff.cursor;
          auVar134 = _DAT_0022f730;
          auVar118 = _DAT_002a98c0;
          if (0 < iVar81) {
            lVar79._0_4_ = psVar101[1].hmtx;
            lVar79._4_4_ = psVar101[1].kern;
            iVar93 = 0;
            do {
              if ((*(int *)(lVar79 + 0xc) != 0) && (*(ushort *)(lVar79 + 6) != 0)) {
                iVar81 = *(int *)(auStack_4a8._8_8_ + 0x28);
                uVar50 = *(ushort *)(lVar79 + 4);
                puVar66 = *(uchar **)(auStack_4a8._8_8_ + 0x18) +
                          (ulong)*(ushort *)(lVar79 + 10) * (long)iVar81 +
                          (ulong)*(ushort *)(lVar79 + 8);
                uVar60 = (uint)*(ushort *)(lVar79 + 6);
                do {
                  if ((ulong)uVar50 != 0) {
                    uVar82 = 0;
                    do {
                      puVar66[uVar82] =
                           *(uchar *)((long)&asStack_238[0].data + (ulong)puVar66[uVar82]);
                      uVar82 = uVar82 + 1;
                    } while (uVar50 != uVar82);
                  }
                  puVar66 = puVar66 + iVar81;
                  bVar49 = 1 < (int)uVar60;
                  uVar60 = uVar60 - 1;
                } while (bVar49);
                iVar81 = psVar101[1].cff.cursor;
              }
              iVar93 = iVar93 + 1;
              lVar79 = lVar79 + 0x10;
            } while (iVar93 < iVar81);
          }
        }
        psVar101[1].hmtx = 0;
        psVar101[1].kern = 0;
        atlas = (ImFontAtlas *)auStack_4a8._8_8_;
      }
      lVar99 = lStack_338 + 1;
    } while (lVar99 < (int)lStack_408);
  }
  ImGui::MemFree(psStack_300);
  ImGui::MemFree(psStack_340);
  pvVar67 = pvStack_410;
  if (pvStack_410 != (void *)0x0) {
    auVar42._8_8_ = 0;
    auVar42._0_8_ = pvStack_410;
    _auStack_418 = (stbtt__buf)(auVar42 << 0x40);
    ImGui::MemFree(pvVar67);
    pvStack_410._0_4_ = 0;
    pvStack_410._4_4_ = 0;
  }
  iVar81 = (int)lStack_408;
  uVar82 = (ulong)(int)lStack_408;
  if (0 < (long)uVar82) {
    auStack_488._0_8_ = pvStack_400;
    uVar78 = 0;
    auVar110._0_12_ = DAT_002a9900._0_12_;
    auVar110._12_2_ = DAT_002a9900._6_2_;
    auVar110._14_2_ = DAT_002a9900._6_2_;
    auVar109._12_4_ = auVar110._12_4_;
    auVar109._0_10_ = (unkbyte10)DAT_002a9900;
    auVar109._10_2_ = DAT_002a9900._4_2_;
    auVar108._10_6_ = auVar109._10_6_;
    auVar108._0_8_ = (undefined8)DAT_002a9900;
    auVar108._8_2_ = DAT_002a9900._4_2_;
    auStack_458._8_8_ = auVar108._8_8_;
    auStack_458._6_2_ = DAT_002a9900._2_2_;
    auStack_458._4_2_ = DAT_002a9900._2_2_;
    auStack_458._0_2_ = (undefined2)DAT_002a9900;
    auStack_458._2_2_ = auStack_458._0_2_;
    do {
      iVar93 = *(int *)(auStack_488._0_8_ + 0xe8 + uVar78 * 0x110);
      if (iVar93 != 0) {
        lVar99 = uVar78 * 0x110 + auStack_488._0_8_;
        pIVar9 = ((ImVector<ImFontConfig> *)(auStack_4a8._8_8_ + 0x60))->Data;
        pIVar100 = pIVar9 + uVar78;
        pIVar8 = pIVar9[uVar78].DstFont;
        if (pIVar9[uVar78].MergeMode == true) {
          uVar7 = pIVar8->ConfigDataCount;
          sVar72 = uVar7 + 1;
          fVar117 = pIVar8->Ascent;
        }
        else {
          fVar97 = pIVar9[uVar78].SizePixels;
          lVar84 = *(long *)(lVar99 + 8);
          lVar79 = (long)*(int *)(lVar99 + 0x24);
          uVar60 = (uint)*(byte *)(lVar84 + 4 + lVar79);
          bVar103 = *(byte *)(lVar84 + 5 + lVar79);
          bVar4 = *(byte *)(lVar84 + 7 + lVar79);
          bVar5 = *(byte *)(lVar84 + 6 + lVar79);
          ImFont::ClearOutputData(pIVar8);
          iVar93 = (uint)bVar5 * 0x100 + uVar60;
          auVar30._1_9_ = (unkuint9)(byte)((uint)iVar93 >> 0x18) << 8;
          auVar30[0] = (char)((uint)iVar93 >> 0x10);
          auVar30._10_6_ = 0;
          auVar46._1_12_ = SUB1612(auVar30 << 0x28,4);
          auVar46[0] = (char)((uint)iVar93 >> 8);
          auVar46[0xd] = 0;
          auVar47._1_14_ = auVar46 << 8;
          auVar47[0] = (char)iVar93;
          auVar47[0xf] = 0;
          auVar118 = ZEXT416((uint)bVar103 | (uint)bVar4 << 0x10) | auVar47 << 8;
          sVar52 = auVar118._0_2_;
          sVar72 = auVar118._2_2_;
          auVar121._0_4_ = (float)((int)sVar52 - (int)sVar72);
          fVar97 = fVar97 / auVar121._0_4_;
          sVar116 = auVar118._6_2_;
          auVar124._0_14_ = ZEXT414((uint)auVar121._0_4_);
          auVar124._14_2_ = sVar116;
          sVar115 = auVar118._4_2_;
          auVar123._12_4_ = auVar124._12_4_;
          auVar123._4_6_ = 0;
          auVar123._0_4_ = auVar121._0_4_;
          auVar123._10_2_ = sVar115;
          auVar122._10_6_ = auVar123._10_6_;
          auVar122._4_6_ = 0;
          auVar122._0_4_ = auVar121._0_4_;
          auVar121._8_8_ = auVar122._8_8_;
          auVar121._6_2_ = sVar72;
          auVar121._4_2_ = (short)((uint)auVar121._0_4_ >> 0x10);
          auVar128._0_2_ = -(ushort)(sVar52 < (short)auStack_458._0_2_);
          auVar128._2_2_ = -(ushort)(sVar52 < (short)auStack_458._2_2_);
          auVar128._4_2_ = -(ushort)(sVar72 < (short)auStack_458._4_2_);
          auVar128._6_2_ = -(ushort)(sVar72 < (short)auStack_458._6_2_);
          auVar128._8_2_ = -(ushort)(sVar115 < (short)auStack_458._8_2_);
          auVar128._10_2_ = -(ushort)(sVar115 < (short)auStack_458._10_2_);
          auVar128._12_2_ = -(ushort)(sVar116 < (short)auStack_458._12_2_);
          auVar128._14_2_ = -(ushort)(sVar116 < (short)auStack_458._14_2_);
          auVar118 = auVar128 & _DAT_00245cc0 | ~auVar128 & _DAT_00245cd0;
          fVar117 = (float)(int)(fVar97 * (float)(int)sVar52 + auVar118._0_4_);
          pIVar8->FontSize = pIVar100->SizePixels;
          pIVar8->ConfigData = pIVar100;
          pIVar8->ContainerAtlas = (ImFontAtlas *)auStack_4a8._8_8_;
          pIVar8->Ascent = fVar117;
          pIVar8->Descent = (float)(int)(fVar97 * (float)(auVar121._4_4_ >> 0x10) + auVar118._4_4_);
          iVar93 = *(int *)(lVar99 + 0xe8);
          sVar72 = 1;
        }
        pIVar8->ConfigDataCount = sVar72;
        if (0 < iVar93) {
          fVar97 = (pIVar100->GlyphOffset).x;
          fVar117 = (float)(int)(fVar117 + 0.5) + (pIVar100->GlyphOffset).y;
          lVar79 = 0;
          lVar84 = 0;
          do {
            lVar77 = *(long *)(lVar99 + 0xd0);
            fVar140 = 1.0 / (float)*(int *)(auStack_4a8._8_8_ + 0x2c);
            fVar139 = 1.0 / (float)*(int *)(auStack_4a8._8_8_ + 0x28);
            ImFont::AddGlyph(pIVar8,pIVar100,*(ImWchar *)(*(long *)(lVar99 + 0x108) + lVar84 * 4),
                             *(float *)(lVar77 + 8 + lVar79) + 0.0 + fVar97,
                             *(float *)(lVar77 + 0xc + lVar79) + 0.0 + fVar117,
                             *(float *)(lVar77 + 0x14 + lVar79) + 0.0 + fVar97,
                             *(float *)(lVar77 + 0x18 + lVar79) + 0.0 + fVar117,
                             (float)*(ushort *)(lVar77 + lVar79) * fVar139,
                             (float)*(ushort *)(lVar77 + 2 + lVar79) * fVar140,
                             (float)*(ushort *)(lVar77 + 4 + lVar79) * fVar139,
                             (float)*(ushort *)(lVar77 + 6 + lVar79) * fVar140,
                             *(float *)(lVar77 + 0x10 + lVar79));
            lVar84 = lVar84 + 1;
            lVar79 = lVar79 + 0x1c;
          } while (lVar84 < *(int *)(lVar99 + 0xe8));
        }
      }
      atlas = (ImFontAtlas *)auStack_4a8._8_8_;
      uVar78 = uVar78 + 1;
    } while (uVar78 < uVar82);
    if (0 < iVar81) {
      puVar83 = (undefined8 *)((long)pvStack_400 + 0x108);
      uVar78 = 0;
      do {
        if ((void *)*puVar83 != (void *)0x0) {
          ImGui::MemFree((void *)*puVar83);
        }
        if ((void *)puVar83[-2] != (void *)0x0) {
          ImGui::MemFree((void *)puVar83[-2]);
        }
        uVar78 = uVar78 + 1;
        puVar83 = puVar83 + 0x22;
      } while (uVar78 < uVar82);
    }
  }
  ImFontAtlasBuildFinish(atlas);
  if (pIStack_3a0 != (ImFontConfig *)0x0) {
    ImGui::MemFree(pIStack_3a0);
  }
  bVar49 = true;
LAB_001f2da0:
  if (pvStack_3d0 != (void *)0x0) {
    ImGui::MemFree(pvStack_3d0);
  }
  if (pvStack_400 != (void *)0x0) {
    ImGui::MemFree(pvStack_400);
  }
  return bVar49;
}

Assistant:

bool    ImFontAtlas::Build()
{
    IM_ASSERT(!Locked && "Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!");

    // Select builder
    // - Note that we do not reassign to atlas->FontBuilderIO, since it is likely to point to static data which
    //   may mess with some hot-reloading schemes. If you need to assign to this (for dynamic selection) AND are
    //   using a hot-reloading scheme that messes up static data, store your own instance of ImFontBuilderIO somewhere
    //   and point to it instead of pointing directly to return value of the GetBuilderXXX functions.
    const ImFontBuilderIO* builder_io = FontBuilderIO;
    if (builder_io == NULL)
    {
#ifdef IMGUI_ENABLE_FREETYPE
        builder_io = ImGuiFreeType::GetBuilderForFreeType();
#elif defined(IMGUI_ENABLE_STB_TRUETYPE)
        builder_io = ImFontAtlasGetBuilderForStbTruetype();
#else
        IM_ASSERT(0); // Invalid Build function
#endif
    }

    // Build
    return builder_io->FontBuilder_Build(this);
}